

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

PackageMempoolAcceptResult * __thiscall
anon_unknown.dwarf_3f42a7c::MemPoolAccept::AcceptMultipleTransactions
          (PackageMempoolAcceptResult *__return_storage_ptr__,MemPoolAccept *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *txns,ATMPArgs *args)

{
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *replaced_txns;
  CAmount *pCVar1;
  size_t *psVar2;
  bool bVar3;
  uint uVar4;
  pointer psVar5;
  element_type *peVar6;
  pointer pCVar7;
  _Base_ptr p_Var8;
  pointer pcVar9;
  CTransactionRef *pCVar10;
  CTransaction *tx;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  CTxMemPool *pCVar12;
  uint64_t mempool_sequence;
  ValidationSignals *this_00;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  string_view source_file;
  PackageValidationState state;
  TxValidationState state_00;
  PackageValidationState state_01;
  PackageValidationState state_02;
  TxValidationState state_03;
  PackageValidationState state_04;
  TxValidationState state_05;
  PackageValidationState state_06;
  TxValidationState state_07;
  PackageValidationState state_08;
  PackageValidationState state_09;
  PackageValidationState state_10;
  TxValidationState state_11;
  TxValidationState state_12;
  TxValidationState state_13;
  PackageValidationState state_14;
  PackageValidationState state_15;
  void *pvVar17;
  CTxMemPool **ppCVar18;
  undefined1 uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  pointer pWVar23;
  ulong uVar24;
  pointer pWVar25;
  long lVar26;
  _Alloc_hider _Var27;
  pointer pWVar28;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  undefined7 uVar32;
  Logger *pLVar29;
  int64_t iVar30;
  _Base_ptr p_Var31;
  _Tp_alloc_type *p_Var33;
  Limits *limits;
  Workspace *__args;
  Workspace *__args_00;
  long lVar34;
  Workspace *extraout_RDX;
  Workspace *extraout_RDX_00;
  Workspace *extraout_RDX_01;
  Workspace *extraout_RDX_02;
  Workspace *extraout_RDX_03;
  Workspace *extraout_RDX_04;
  Workspace *extraout_RDX_05;
  Workspace *extraout_RDX_06;
  Workspace *extraout_RDX_07;
  Workspace *extraout_RDX_08;
  Workspace *extraout_RDX_09;
  Workspace *extraout_RDX_10;
  Workspace *extraout_RDX_11;
  Workspace *extraout_RDX_12;
  Workspace *extraout_RDX_13;
  Workspace *extraout_RDX_14;
  Workspace *extraout_RDX_15;
  Workspace *extraout_RDX_16;
  Workspace *extraout_RDX_17;
  Workspace *extraout_RDX_18;
  Workspace *extraout_RDX_19;
  Workspace *extraout_RDX_20;
  Workspace *extraout_RDX_21;
  Workspace *extraout_RDX_22;
  Workspace *pWVar35;
  _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *p_Var36;
  setEntries *mempool_ancestors;
  size_type sVar37;
  pointer pWVar38;
  ValidationState<PackageValidationResult> *state_16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar39;
  ulong uVar40;
  pointer pcVar41;
  long *plVar42;
  CFeeRate relay_fee;
  pointer pWVar43;
  pointer pWVar44;
  pointer psVar45;
  MemPoolAccept *this_01;
  iterator __end1;
  _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *this_02;
  iterator __begin1;
  long *plVar46;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_uint256,_MempoolAcceptResult>_> __l;
  initializer_list<transaction_identifier<true>_> __l_00;
  initializer_list<transaction_identifier<true>_> __l_01;
  string_view str;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  setEntries *__range1;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  all_package_wtxids;
  CFeeRate package_feerate;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  all_package_wtxids_1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err;
  TxValidationState placeholder_state;
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  results;
  PackageValidationState package_state;
  Result<void> result;
  size_type __dnew_1;
  CFeeRate package_feerate_1;
  CFeeRate parent_feerate;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  effective_feerate_wtxids_1;
  undefined4 in_stack_fffffffffffff5a8;
  undefined4 uVar47;
  undefined4 in_stack_fffffffffffff5ac;
  undefined4 uVar48;
  string *__return_storage_ptr___00;
  char *in_stack_fffffffffffff5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5b8;
  undefined4 in_stack_fffffffffffff5c0;
  undefined4 in_stack_fffffffffffff5c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5c8;
  undefined8 in_stack_fffffffffffff5d0;
  MemPoolAccept *pMVar49;
  pointer in_stack_fffffffffffff5d8;
  pointer __first;
  undefined4 in_stack_fffffffffffff5e0;
  uint uVar50;
  undefined4 in_stack_fffffffffffff5e4;
  SubPackageState *replaced_txns_00;
  undefined4 uVar51;
  undefined8 in_stack_fffffffffffff5e8;
  byte local_a00;
  allocator_type local_9e1;
  CFeeRate local_9e0;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> local_9d8;
  CFeeRate local_9c0;
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  local_9b8;
  long local_998;
  unsigned_long local_990;
  size_type local_988;
  size_t local_980;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> local_978;
  unique_lock<std::recursive_mutex> local_958;
  undefined1 local_948 [8];
  long *local_940;
  long local_930 [2];
  long *local_920 [2];
  long local_910 [2];
  undefined1 local_900 [8];
  long *local_8f8;
  long local_8e8 [2];
  long *local_8d8 [2];
  long local_8c8 [2];
  undefined1 local_8b8 [8];
  long *local_8b0;
  long local_8a0 [2];
  long *local_890 [2];
  long local_880 [2];
  undefined1 local_870 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_868;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_858;
  long *local_848 [2];
  long local_838 [2];
  undefined8 local_828;
  long *local_820 [2];
  long local_810 [2];
  long *local_800 [2];
  long local_7f0 [2];
  undefined1 local_7e0 [8];
  long *local_7d8;
  long local_7c8 [2];
  long *local_7b8 [2];
  long local_7a8 [2];
  undefined1 local_798 [8];
  long *local_790;
  long local_780 [2];
  long *local_770 [2];
  long local_760 [2];
  undefined1 local_750 [8];
  undefined1 local_748 [16];
  undefined1 local_738 [16];
  string local_728 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_720;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_710;
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_700 [3];
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_6b8;
  bool local_6a0;
  undefined1 local_670 [8];
  long *local_668;
  long local_658 [2];
  long *local_648 [2];
  long local_638 [2];
  ValidationState<TxValidationResult> local_628;
  undefined1 local_5e0 [8];
  _Base_ptr *local_5d8;
  _Base_ptr local_5c8 [2];
  long *local_5b8 [2];
  long local_5a8 [2];
  undefined1 local_598 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_590;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580;
  long *local_570 [2];
  long local_560 [2];
  undefined8 local_550;
  long *local_548 [2];
  long local_538 [2];
  long *local_528 [2];
  long local_518 [2];
  undefined1 local_508 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  long *local_4e0 [2];
  long local_4d0 [2];
  undefined8 local_4c0;
  long *local_4b8 [2];
  long local_4a8 [2];
  long *local_498 [2];
  long local_488 [2];
  _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  local_478;
  undefined1 local_448 [8];
  _Base_ptr *local_440;
  _Base_ptr local_430 [2];
  long *local_420 [2];
  long local_410 [2];
  ValidationState<PackageValidationResult> local_400;
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  undefined1 local_398 [9];
  bool bStack_38f;
  bool bStack_38e;
  bool bStack_38d;
  undefined4 uStack_38c;
  undefined1 local_388 [32];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_348;
  _Storage<CFeeRate,_true> local_330;
  _Head_base<0UL,_CTxMemPoolEntry_*,_false> _Stack_328;
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_320;
  bool local_308;
  _Storage<uint256,_true> local_300;
  undefined1 local_2e0 [32];
  _Alloc_hider local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  undefined1 local_2a0 [264];
  undefined1 local_198 [40];
  undefined1 local_170 [8];
  char *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  long *local_148 [2];
  long local_138 [2];
  undefined1 local_128 [8];
  char *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  long *local_100 [2];
  long local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 local_d0 [48];
  __index_type local_a0;
  CFeeRate local_98 [4];
  Limits local_78;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_400.m_reject_reason._M_dataplus._M_p = (pointer)&local_400.m_reject_reason.field_2;
  local_400.m_mode = M_VALID;
  local_400.m_result = PCKG_RESULT_UNSET;
  local_400.m_reject_reason._M_string_length = 0;
  local_400.m_reject_reason.field_2._M_local_buf[0] = '\0';
  local_400.m_debug_message._M_dataplus._M_p = (pointer)&local_400.m_debug_message.field_2;
  local_400.m_debug_message._M_string_length = 0;
  local_400.m_debug_message.field_2._M_local_buf[0] = '\0';
  state_16 = &local_400;
  bVar20 = IsWellFormedPackage(txns,(PackageValidationState *)state_16,true);
  if (bVar20) {
    local_9b8.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_9b8.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_9b8.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var36 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
               *)((long)(txns->
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(txns->
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4);
    if ((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
         *)0x38e38e38e38e38 < p_Var36) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_length_error("vector::reserve");
LAB_00b2dca6:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      goto LAB_00b2ed6b;
    }
    p_Var33 = (_Tp_alloc_type *)0x8e38e38e38e38e39;
    if (p_Var36 !=
        (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
         *)0x0) {
      pWVar23 = std::
                _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ::_M_allocate(p_Var36,(size_t)state_16);
      std::
      vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ::_S_relocate((pointer)0x0,(pointer)0x0,pWVar23,p_Var33);
      local_9b8.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pWVar23 + (long)p_Var36;
      local_9b8.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_finish = pWVar23;
    }
    psVar5 = (txns->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pWVar25 = local_9b8.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __first = local_9b8.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_9b8.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_9b8.
         super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pWVar28 = local_9b8.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pWVar43 = (pointer)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0);
    for (psVar45 = (txns->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; psVar45 != psVar5;
        psVar45 = psVar45 + 1) {
      local_398._0_8_ = local_3b8 + 8;
      local_3b8._8_4_ = _S_red;
      local_3a8._M_local_buf[0] = '\0';
      local_3a8._M_local_buf[1] = '\0';
      local_3a8._M_local_buf[2] = '\0';
      local_3a8._M_local_buf[3] = '\0';
      local_3a8._M_local_buf[4] = '\0';
      local_3a8._M_local_buf[5] = '\0';
      local_3a8._M_local_buf[6] = '\0';
      local_3a8._M_local_buf[7] = '\0';
      local_3a8._M_local_buf[8] = (char)local_398._0_8_;
      local_3a8._9_7_ = (undefined7)((ulong)local_398._0_8_ >> 8);
      stack0xfffffffffffffc70 = 0;
      local_388._24_8_ = local_388 + 8;
      local_388._8_4_ = _S_red;
      local_388._16_8_ = (_Base_ptr)0x0;
      local_368._8_8_ = (_List_node_base *)0x0;
      local_358._8_4_ = _S_red;
      local_348._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      local_348._M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)((long)local_358 + 8);
      local_300._0_8_ = (void *)0x0;
      local_320._0_1_ = false;
      local_330 = (_Storage<CFeeRate,_true>)0x0;
      _Stack_328._M_head_impl = (CTxMemPoolEntry *)0x0;
      local_300._16_8_ =
           &((psVar45->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            hash;
      local_300._24_8_ = 0;
      local_2e0._0_8_ = local_2e0 + 0x10;
      local_2e0._8_8_ = 0;
      local_2e0[0x10] = '\0';
      local_2c0._M_p = (pointer)&local_2b0;
      local_2b8 = 0;
      local_2b0._M_local_buf[0] = '\0';
      local_368._0_8_ = local_388._24_8_;
      local_348._M_impl._M_node._M_size =
           (size_t)local_348._M_impl._M_node.super__List_node_base._M_prev;
      local_300._8_8_ = psVar45;
      memset(local_2a0,0,0x102);
      local_198._0_8_ = (pointer)0x0;
      local_198[8] = 0;
      local_198._9_7_ = 0;
      local_198[0x10] = 0;
      local_198._17_8_ = 0;
      if (pWVar25 == pWVar28) {
        lVar34 = (long)pWVar25 - (long)__first;
        if (lVar34 == 0x7ffffffffffffe00) {
          local_9b8.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_start = __first;
          local_9b8.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_finish = pWVar25;
          local_9b8.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pWVar28;
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00b2ed6b;
          std::__throw_length_error("vector::_M_realloc_insert");
          goto LAB_00b2dc67;
        }
        uVar24 = (lVar34 >> 6) * -0x71c71c71c71c71c7;
        uVar40 = 1;
        if (pWVar25 != __first) {
          uVar40 = uVar24;
        }
        p_Var36 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                   *)(uVar40 + uVar24);
        if ((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
             *)0x38e38e38e38e37 < p_Var36) {
          p_Var36 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     *)0x38e38e38e38e38;
        }
        p_Var33 = (_Tp_alloc_type *)(uVar40 + uVar24);
        this_02 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                   *)0x38e38e38e38e38;
        if (!CARRY8(uVar40,uVar24)) {
          this_02 = p_Var36;
        }
        in_stack_fffffffffffff5d8 =
             std::
             _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
             ::_M_allocate(this_02,0x38e38e38e38e38);
        std::allocator_traits<std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>::
        construct<(anonymous_namespace)::MemPoolAccept::Workspace,(anonymous_namespace)::MemPoolAccept::Workspace>
                  ((allocator_type *)(lVar34 + (long)in_stack_fffffffffffff5d8),
                   (Workspace *)local_3b8,__args_00);
        pWVar25 = std::
                  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ::_S_relocate(__first,pWVar25,in_stack_fffffffffffff5d8,p_Var33);
        if (__first != (pointer)0x0) {
          operator_delete(__first,(long)pWVar28 - (long)__first);
        }
        pWVar28 = in_stack_fffffffffffff5d8 + (long)this_02;
      }
      else {
        std::allocator_traits<std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>::
        construct<(anonymous_namespace)::MemPoolAccept::Workspace,(anonymous_namespace)::MemPoolAccept::Workspace>
                  ((allocator_type *)pWVar25,(Workspace *)local_3b8,__args);
        in_stack_fffffffffffff5d8 = __first;
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_p != &local_2b0) {
        operator_delete(local_2c0._M_p,
                        CONCAT71(local_2b0._M_allocated_capacity._1_7_,local_2b0._M_local_buf[0]) +
                        1);
      }
      if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
        operator_delete((void *)local_2e0._0_8_,CONCAT71(local_2e0._17_7_,local_2e0[0x10]) + 1);
      }
      if (_Stack_328._M_head_impl != (CTxMemPoolEntry *)0x0) {
        std::default_delete<CTxMemPoolEntry>::operator()
                  ((default_delete<CTxMemPoolEntry> *)&_Stack_328,_Stack_328._M_head_impl);
      }
      pWVar25 = pWVar25 + 1;
      _Stack_328._M_head_impl = (CTxMemPoolEntry *)0x0;
      std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)local_358);
      std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)local_388);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                   *)local_3b8);
      __first = in_stack_fffffffffffff5d8;
      pWVar43 = pWVar28;
    }
    local_478._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_478._M_impl.super__Rb_tree_header._M_header;
    local_478._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_478._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_478._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_958._M_device = &(this->m_pool->cs).super_recursive_mutex;
    local_958._M_owns = false;
    this_01 = this;
    local_9b8.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_start = __first;
    local_9b8.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_finish = pWVar25;
    local_9b8.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pWVar28;
    local_478._M_impl.super__Rb_tree_header._M_header._M_right =
         local_478._M_impl.super__Rb_tree_header._M_header._M_left;
    std::unique_lock<std::recursive_mutex>::lock(&local_958);
    pWVar23 = local_9b8.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_9b8.
        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_9b8.
        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pWVar38 = local_9b8.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar20 = PreChecks(this,args,pWVar38);
        if (!bVar20) {
          local_3b8[0] = SUB81(&local_3a8,0);
          local_3b8._1_7_ = (undefined7)((ulong)&local_3a8 >> 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3b8,"transaction failed","");
          local_750 = (undefined1  [8])(local_748 + 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"");
          ValidationState<PackageValidationResult>::Invalid
                    (&local_400,PCKG_TX,(string *)local_3b8,(string *)local_750);
          if (local_750 != (undefined1  [8])(local_748 + 8)) {
            operator_delete((void *)local_750,(ulong)(local_748._8_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_3b8._1_7_,local_3b8[0]) != &local_3a8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_3b8._1_7_,local_3b8[0]),
                            CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0]
                                    ) + 1);
          }
          peVar6 = (pWVar38->m_ptx->
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_4c0._0_4_ = (pWVar38->m_state).super_ValidationState<TxValidationResult>.m_mode;
          local_4c0._4_4_ = (pWVar38->m_state).super_ValidationState<TxValidationResult>.m_result;
          pcVar41 = (pWVar38->m_state).super_ValidationState<TxValidationResult>.m_reject_reason.
                    _M_dataplus._M_p;
          local_4b8[0] = local_4a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4b8,pcVar41,
                     pcVar41 + (pWVar38->m_state).super_ValidationState<TxValidationResult>.
                               m_reject_reason._M_string_length);
          pcVar41 = (pWVar38->m_state).super_ValidationState<TxValidationResult>.m_debug_message.
                    _M_dataplus._M_p;
          local_498[0] = local_488;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_498,pcVar41,
                     pcVar41 + (pWVar38->m_state).super_ValidationState<TxValidationResult>.
                               m_debug_message._M_string_length);
          state_00.super_ValidationState<TxValidationResult>.m_result = in_stack_fffffffffffff5ac;
          state_00.super_ValidationState<TxValidationResult>.m_mode = in_stack_fffffffffffff5a8;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
               in_stack_fffffffffffff5b0;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
               (size_type)in_stack_fffffffffffff5b8;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
               in_stack_fffffffffffff5c8;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)this_01;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
               (size_type)in_stack_fffffffffffff5d8;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity._0_4_ = (int)pWVar43;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity._4_4_ = (int)((ulong)pWVar43 >> 0x20);
          state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ = args;
          MempoolAcceptResult::Failure((MempoolAcceptResult *)local_3b8,state_00);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
          ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                    ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                      *)&local_478,&peVar6->m_witness_hash,(MempoolAcceptResult *)local_3b8);
          if (local_308 == true) {
            local_308 = false;
            pvVar17 = (void *)CONCAT71(local_320._1_7_,local_320._0_1_);
            if (pvVar17 != (void *)0x0) {
              operator_delete(pvVar17,(long)local_320._M_value.
                                            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)pvVar17);
            }
          }
          std::__cxx11::
          _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)local_368);
          if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
            operator_delete((void *)local_388._0_8_,(ulong)(local_388._16_8_ + 1));
          }
          if ((undefined1 *)
              CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0]) != local_398
             ) {
            operator_delete((undefined1 *)
                            CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0]
                                    ),(ulong)((long)&((_Base_ptr)local_398._0_8_)->_M_color + 1));
          }
          if (local_498[0] != local_488) {
            operator_delete(local_498[0],local_488[0] + 1);
          }
          if (local_4b8[0] != local_4a8) {
            operator_delete(local_4b8[0],local_4a8[0] + 1);
          }
          local_508._0_4_ = local_400.m_mode;
          local_508._4_4_ = local_400.m_result;
          local_500 = &local_4f0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_500,local_400.m_reject_reason._M_dataplus._M_p,
                     local_400.m_reject_reason._M_dataplus._M_p +
                     local_400.m_reject_reason._M_string_length);
          local_4e0[0] = local_4d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4e0,local_400.m_debug_message._M_dataplus._M_p,
                     local_400.m_debug_message._M_dataplus._M_p +
                     local_400.m_debug_message._M_string_length);
          state_01.super_ValidationState<PackageValidationResult>.m_result =
               in_stack_fffffffffffff5ac;
          state_01.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff5a8
          ;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
               in_stack_fffffffffffff5b0;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
               (size_type)in_stack_fffffffffffff5b8;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
               in_stack_fffffffffffff5c8;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)this_01;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
               (size_type)in_stack_fffffffffffff5d8;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity._0_4_ = (int)pWVar43;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity._4_4_ = (int)((ulong)pWVar43 >> 0x20);
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
               args;
          PackageMempoolAcceptResult::PackageMempoolAcceptResult
                    (__return_storage_ptr__,state_01,
                     (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      *)local_508);
          if (local_4e0[0] != local_4d0) {
            operator_delete(local_4e0[0],local_4d0[0] + 1);
          }
          _Var27._M_p = (pointer)local_500;
          if (local_500 != &local_4f0) goto LAB_00b2b56d;
          goto LAB_00b2d41c;
        }
        if ((args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
            super__Optional_payload_base<CFeeRate>._M_engaged == true) {
          CFeeRate::CFeeRate((CFeeRate *)local_3b8,&pWVar38->m_modified_fees,
                             (uint32_t)pWVar38->m_vsize);
          if ((args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
              super__Optional_payload_base<CFeeRate>._M_engaged == false) goto LAB_00b2dc67;
          if ((long)(args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>.
                    _M_payload.super__Optional_payload_base<CFeeRate>._M_payload <
              CONCAT71(local_3b8._1_7_,local_3b8[0])) {
            local_3b8[0] = SUB81(&local_3a8,0);
            uVar19 = local_3b8[0];
            local_3b8._1_7_ = (undefined7)((ulong)&local_3a8 >> 8);
            uVar32 = local_3b8._1_7_;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3b8,"max feerate exceeded","");
            _Var27._M_p = local_748 + 8;
            local_750 = (undefined1  [8])_Var27._M_p;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"");
            ValidationState<TxValidationResult>::Invalid
                      (&(pWVar38->m_state).super_ValidationState<TxValidationResult>,
                       TX_MEMPOOL_POLICY,(string *)local_3b8,(string *)local_750);
            if (local_750 != (undefined1  [8])_Var27._M_p) {
              operator_delete((void *)local_750,(ulong)(local_748._8_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_3b8._1_7_,local_3b8[0]) != &local_3a8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_3b8._1_7_,local_3b8[0]),
                              CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                       local_3a8._M_local_buf[0]) + 1);
            }
            local_3b8[0] = uVar19;
            local_3b8._1_7_ = uVar32;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3b8,"transaction failed","");
            local_750 = (undefined1  [8])_Var27._M_p;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"");
            ValidationState<PackageValidationResult>::Invalid
                      (&local_400,PCKG_TX,(string *)local_3b8,(string *)local_750);
            if (local_750 != (undefined1  [8])_Var27._M_p) {
              operator_delete((void *)local_750,(ulong)(local_748._8_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_3b8._1_7_,local_3b8[0]) != &local_3a8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_3b8._1_7_,local_3b8[0]),
                              CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                       local_3a8._M_local_buf[0]) + 1);
            }
            peVar6 = (pWVar38->m_ptx->
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_550._0_4_ = (pWVar38->m_state).super_ValidationState<TxValidationResult>.m_mode;
            local_550._4_4_ = (pWVar38->m_state).super_ValidationState<TxValidationResult>.m_result;
            pcVar41 = (pWVar38->m_state).super_ValidationState<TxValidationResult>.m_reject_reason.
                      _M_dataplus._M_p;
            local_548[0] = local_538;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_548,pcVar41,
                       pcVar41 + (pWVar38->m_state).super_ValidationState<TxValidationResult>.
                                 m_reject_reason._M_string_length);
            pcVar41 = (pWVar38->m_state).super_ValidationState<TxValidationResult>.m_debug_message.
                      _M_dataplus._M_p;
            local_528[0] = local_518;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_528,pcVar41,
                       pcVar41 + (pWVar38->m_state).super_ValidationState<TxValidationResult>.
                                 m_debug_message._M_string_length);
            state_03.super_ValidationState<TxValidationResult>.m_result = in_stack_fffffffffffff5ac;
            state_03.super_ValidationState<TxValidationResult>.m_mode = in_stack_fffffffffffff5a8;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
                 in_stack_fffffffffffff5b0;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
                 (size_type)in_stack_fffffffffffff5b8;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
                 in_stack_fffffffffffff5c8;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
                 (pointer)this_01;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
                 (size_type)in_stack_fffffffffffff5d8;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity._0_4_ = (int)pWVar43;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity._4_4_ = (int)((ulong)pWVar43 >> 0x20);
            state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ = args;
            MempoolAcceptResult::Failure((MempoolAcceptResult *)local_3b8,state_03);
            std::
            _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
            ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                      ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                        *)&local_478,&peVar6->m_witness_hash,(MempoolAcceptResult *)local_3b8);
            if (local_308 == true) {
              local_308 = false;
              pvVar17 = (void *)CONCAT71(local_320._1_7_,local_320._0_1_);
              if (pvVar17 != (void *)0x0) {
                operator_delete(pvVar17,(long)local_320._M_value.
                                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)pvVar17);
              }
            }
            std::__cxx11::
            _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)local_368);
            if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
              operator_delete((void *)local_388._0_8_,(ulong)(local_388._16_8_ + 1));
            }
            if ((undefined1 *)
                CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0]) !=
                local_398) {
              operator_delete((undefined1 *)
                              CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                       local_3a8._M_local_buf[0]),
                              (ulong)((long)&((_Base_ptr)local_398._0_8_)->_M_color + 1));
            }
            if (local_528[0] != local_518) {
              operator_delete(local_528[0],local_518[0] + 1);
            }
            if (local_548[0] != local_538) {
              operator_delete(local_548[0],local_538[0] + 1);
            }
            local_598._0_4_ = local_400.m_mode;
            local_598._4_4_ = local_400.m_result;
            local_590 = &local_580;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_590,local_400.m_reject_reason._M_dataplus._M_p,
                       local_400.m_reject_reason._M_dataplus._M_p +
                       local_400.m_reject_reason._M_string_length);
            local_570[0] = local_560;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_570,local_400.m_debug_message._M_dataplus._M_p,
                       local_400.m_debug_message._M_dataplus._M_p +
                       local_400.m_debug_message._M_string_length);
            state_04.super_ValidationState<PackageValidationResult>.m_result =
                 in_stack_fffffffffffff5ac;
            state_04.super_ValidationState<PackageValidationResult>.m_mode =
                 in_stack_fffffffffffff5a8;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p
                 = in_stack_fffffffffffff5b0;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
                 = (size_type)in_stack_fffffffffffff5b8;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
                 in_stack_fffffffffffff5c8;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
                 = (pointer)this_01;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length
                 = (size_type)in_stack_fffffffffffff5d8;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity._0_4_ = (int)pWVar43;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity._4_4_ = (int)((ulong)pWVar43 >> 0x20);
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
                 args;
            PackageMempoolAcceptResult::PackageMempoolAcceptResult
                      (__return_storage_ptr__,state_04,
                       (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)local_598);
            if (local_570[0] != local_560) {
              operator_delete(local_570[0],local_560[0] + 1);
            }
            local_4f0._M_allocated_capacity = local_580._M_allocated_capacity;
            _Var27._M_p = (pointer)local_590;
            if (local_590 != &local_580) goto LAB_00b2b56d;
            goto LAB_00b2d41c;
          }
        }
        CCoinsViewMemPool::PackageAddTransaction(&this->m_viewmempool,pWVar38->m_ptx);
        pWVar38 = pWVar38 + 1;
      } while (pWVar38 != pWVar23);
    }
    pWVar23 = local_9b8.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_9b8.
        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_9b8.
        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00b2a932:
      pWVar38 = local_9b8.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pWVar23 = local_9b8.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar34 = 0;
      for (pWVar28 = local_9b8.
                     super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pWVar28 !=
          local_9b8.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_finish; pWVar28 = pWVar28 + 1) {
        lVar34 = lVar34 + pWVar28->m_vsize;
      }
      replaced_txns_00 = &this->m_subpackage;
      (this->m_subpackage).m_total_vsize = lVar34;
      lVar26 = 0;
      for (pWVar28 = local_9b8.
                     super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pWVar28 !=
          local_9b8.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_finish; pWVar28 = pWVar28 + 1) {
        lVar26 = lVar26 + pWVar28->m_modified_fees;
      }
      replaced_txns_00->m_total_modified_fees = lVar26;
      CFeeRate::CFeeRate(&local_9c0,&replaced_txns_00->m_total_modified_fees,(uint32_t)lVar34);
      local_9d8.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_9d8.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (transaction_identifier<true> *)0x0;
      local_9d8.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (transaction_identifier<true> *)0x0;
      sVar37 = ((long)pWVar38 - (long)pWVar23 >> 6) * -0x71c71c71c71c71c7;
      std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
      reserve(&local_9d8,sVar37);
      pWVar35 = extraout_RDX;
      if (pWVar23 != pWVar38) {
        do {
          peVar6 = (pWVar23->m_ptx->
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          uVar13 = *(undefined8 *)
                    (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          uVar14 = *(undefined8 *)
                    ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 8);
          uVar15 = *(undefined8 *)
                    ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 0x10);
          uVar16 = *(undefined8 *)
                    ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 0x18);
          local_3a8._M_local_buf[0] = (char)uVar15;
          local_3a8._M_allocated_capacity._1_7_ = (undefined7)((ulong)uVar15 >> 8);
          local_3a8._M_local_buf[8] = (char)uVar16;
          local_3a8._9_7_ = (undefined7)((ulong)uVar16 >> 8);
          local_3b8[0] = (undefined1)uVar13;
          local_3b8._1_7_ = (undefined7)((ulong)uVar13 >> 8);
          local_3b8._8_4_ = (undefined4)uVar14;
          local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x20);
          if (local_9d8.
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_9d8.
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>::
            _M_realloc_insert<transaction_identifier<true>>
                      ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                        *)&local_9d8,
                       (iterator)
                       local_9d8.
                       super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (transaction_identifier<true> *)local_3b8);
            pWVar35 = extraout_RDX_00;
          }
          else {
            uVar13 = *(undefined8 *)
                      (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            uVar14 = *(undefined8 *)
                      ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                             _M_elems + 8);
            uVar15 = *(undefined8 *)
                      ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                             _M_elems + 0x18);
            *(undefined8 *)
             (((local_9d8.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data
              ._M_elems + 0x10) =
                 *(undefined8 *)
                  ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                  0x10);
            *(undefined8 *)
             (((local_9d8.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data
              ._M_elems + 0x18) = uVar15;
            *(undefined8 *)
             ((local_9d8.
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
             _M_elems = uVar13;
            *(undefined8 *)
             (((local_9d8.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data
              ._M_elems + 8) = uVar14;
            local_9d8.
            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_9d8.
                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pWVar23 = pWVar23 + 1;
        } while (pWVar23 != pWVar38);
      }
      local_628.m_reject_reason._M_dataplus._M_p = (pointer)&local_628.m_reject_reason.field_2;
      local_628.m_mode = M_VALID;
      local_628.m_result = TX_RESULT_UNSET;
      local_628.m_reject_reason._M_string_length = 0;
      local_628.m_reject_reason.field_2._M_local_buf[0] = '\0';
      local_628.m_debug_message._M_dataplus._M_p = (pointer)&local_628.m_debug_message.field_2;
      local_628.m_debug_message._M_string_length = 0;
      local_628.m_debug_message.field_2._M_local_buf[0] = '\0';
      if (args->m_package_feerates == true) {
        bVar20 = CheckFeeRate(this,(this->m_subpackage).m_total_vsize,
                              (this->m_subpackage).m_total_modified_fees,
                              (TxValidationState *)&local_628);
        pWVar35 = extraout_RDX_01;
        if (bVar20) goto LAB_00b2aab2;
        local_3b8[0] = SUB81(&local_3a8,0);
        local_3b8._1_7_ = (undefined7)((ulong)&local_3a8 >> 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"transaction failed","")
        ;
        local_750 = (undefined1  [8])(local_748 + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"");
        ValidationState<PackageValidationResult>::Invalid
                  (&local_400,PCKG_TX,(string *)local_3b8,(string *)local_750);
        if (local_750 != (undefined1  [8])(local_748 + 8)) {
          operator_delete((void *)local_750,(ulong)(local_748._8_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_3b8._1_7_,local_3b8[0]) != &local_3a8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_3b8._1_7_,local_3b8[0]),
                          CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0])
                          + 1);
        }
        local_670._0_4_ = local_400.m_mode;
        local_670._4_4_ = local_400.m_result;
        plVar46 = local_658;
        local_668 = plVar46;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_668,local_400.m_reject_reason._M_dataplus._M_p,
                   local_400.m_reject_reason._M_dataplus._M_p +
                   local_400.m_reject_reason._M_string_length);
        local_648[0] = local_638;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_648,local_400.m_debug_message._M_dataplus._M_p,
                   local_400.m_debug_message._M_dataplus._M_p +
                   local_400.m_debug_message._M_string_length);
        peVar6 = ((pWVar38[-1].m_ptx)->
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_798._0_4_ = local_628.m_mode;
        local_798._4_4_ = local_628.m_result;
        local_790 = local_780;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_790,local_628.m_reject_reason._M_dataplus._M_p,
                   local_628.m_reject_reason._M_dataplus._M_p +
                   local_628.m_reject_reason._M_string_length);
        local_770[0] = local_760;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_770,local_628.m_debug_message._M_dataplus._M_p,
                   local_628.m_debug_message._M_dataplus._M_p +
                   local_628.m_debug_message._M_string_length);
        CFeeRate::CFeeRate(&local_9e0,&replaced_txns_00->m_total_modified_fees,
                           (uint32_t)(this->m_subpackage).m_total_vsize);
        state_05.super_ValidationState<TxValidationResult>.m_result = in_stack_fffffffffffff5ac;
        state_05.super_ValidationState<TxValidationResult>.m_mode = in_stack_fffffffffffff5a8;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
             in_stack_fffffffffffff5b0;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
             (size_type)in_stack_fffffffffffff5b8;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
             in_stack_fffffffffffff5c8;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)this_01;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
             (size_type)in_stack_fffffffffffff5d8;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity._0_4_ = (int)replaced_txns_00;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity._4_4_ = (int)((ulong)replaced_txns_00 >> 0x20);
        state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ = args;
        MempoolAcceptResult::FeeFailure
                  ((MempoolAcceptResult *)local_750,state_05,(CFeeRate)local_798,
                   (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)local_9e0.nSatoshisPerK);
        uVar13 = *(undefined8 *)
                  (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar14 = *(undefined8 *)
                  ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                  8);
        uVar15 = *(undefined8 *)
                  ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                  0x10);
        uVar16 = *(undefined8 *)
                  ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                  0x18);
        local_3a8._M_local_buf[0] = (char)uVar15;
        local_3a8._M_allocated_capacity._1_7_ = (undefined7)((ulong)uVar15 >> 8);
        local_3a8._M_local_buf[8] = (char)uVar16;
        local_3a8._9_7_ = (undefined7)((ulong)uVar16 >> 8);
        local_3b8[0] = (undefined1)uVar13;
        local_3b8._1_7_ = (undefined7)((ulong)uVar13 >> 8);
        local_3b8._8_4_ = (undefined4)uVar14;
        local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x20);
        MempoolAcceptResult::MempoolAcceptResult
                  ((MempoolAcceptResult *)local_398,(MempoolAcceptResult *)local_750);
        __l._M_len = 1;
        __l._M_array = (iterator)local_3b8;
        std::
        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               *)local_e0,__l,(less<uint256> *)local_128,(allocator_type *)local_170);
        state_06.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffff5ac
        ;
        state_06.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff5a8;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             in_stack_fffffffffffff5b0;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
             (size_type)in_stack_fffffffffffff5b8;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
             in_stack_fffffffffffff5c8;
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
             (pointer)this_01;
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)in_stack_fffffffffffff5d8;
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity._0_4_ = (int)replaced_txns_00;
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity._4_4_ = (int)((ulong)replaced_txns_00 >> 0x20);
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ = args
        ;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_06,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)local_670);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     *)local_e0);
        if ((local_300._M_value.super_base_blob<256U>.m_data._M_elems[0x18] == M_INVALID) &&
           (local_300._24_8_ = local_300._24_8_ & 0xffffffffffffff00,
           (void *)local_300._0_8_ != (void *)0x0)) {
          operator_delete((void *)local_300._0_8_,local_300._16_8_ - local_300._0_8_);
        }
        std::__cxx11::
        _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::_M_clear(&local_348);
        if ((_Base_ptr)local_368._0_8_ != (_Base_ptr)local_358) {
          operator_delete((void *)local_368._0_8_,local_358._0_8_ + 1);
        }
        if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
          operator_delete((void *)local_388._0_8_,(ulong)(local_388._16_8_ + 1));
        }
        if ((local_6a0 == true) &&
           (local_6a0 = false,
           local_6b8._M_value.
           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
           ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_6b8._M_value.
                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_6b8._M_value.
                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - local_6b8._0_8_
                         );
        }
        std::__cxx11::
        _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::_M_clear(local_700);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._M_allocated_capacity != &local_710) {
          operator_delete((void *)local_720._M_allocated_capacity,
                          local_710._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_748._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_738 + 8)) {
          operator_delete((void *)local_748._8_8_,local_738._8_8_ + 1);
        }
        if (local_770[0] != local_760) {
          operator_delete(local_770[0],local_760[0] + 1);
        }
        if (local_790 != local_780) {
          operator_delete(local_790,local_780[0] + 1);
        }
        plVar42 = local_668;
        if (local_648[0] != local_638) {
          operator_delete(local_648[0],local_638[0] + 1);
          plVar42 = local_668;
        }
      }
      else {
LAB_00b2aab2:
        __return_storage_ptr___00 =
             (string *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8);
        pWVar28 = (pointer)(txns->
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
        pWVar43 = (pointer)(txns->
                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
        if (0x10 < (ulong)((long)pWVar43 - (long)pWVar28)) {
          iVar30 = (this->m_subpackage).m_total_vsize;
          lVar34 = (long)pWVar43 - (long)pWVar28 >> 6;
          p_Var31 = (_Base_ptr)local_398._0_8_;
          if (0 < lVar34) {
            lVar34 = lVar34 + 1;
            pWVar28 = (pointer)&(((_Rep_type *)&pWVar28->m_conflicts)->_M_impl).
                                super__Rb_tree_header._M_header._M_right;
            this = this_01;
            do {
              pWVar25 = pWVar28;
              local_398._4_4_ = (undefined4)((ulong)p_Var31 >> 0x20);
              pCVar7 = pWVar25[-1].m_precomputed_txdata.m_spent_outputs.
                       super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_3b8[0] = (string)0x0;
              uVar13 = *(undefined8 *)((long)&pCVar7[1].scriptPubKey.super_CScriptBase._union + 9);
              uVar14 = *(undefined8 *)
                        ((long)&pCVar7[1].scriptPubKey.super_CScriptBase._union + 0x11);
              uVar15 = *(undefined8 *)
                        ((long)&pCVar7[1].scriptPubKey.super_CScriptBase._union + 0x19);
              uVar16 = *(undefined8 *)((long)&pCVar7[2].nValue + 1);
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)uVar15;
              local_3a8._M_local_buf[8] = (char)((ulong)uVar15 >> 0x38);
              local_3a8._9_7_ = (undefined7)uVar16;
              local_398._1_3_ = (undefined3)((ulong)p_Var31 >> 8);
              local_398[0] = (undefined1)((ulong)uVar16 >> 0x38);
              local_3b8._1_7_ = (undefined7)uVar13;
              local_3b8[8] = (undefined1)((ulong)uVar13 >> 0x38);
              local_3b8._9_3_ = (undefined3)uVar14;
              local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x18);
              local_3a8._M_local_buf[0] = (char)((ulong)uVar14 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)local_3b8);
              if (bVar20) {
                pWVar25 = (pointer)&pWVar25[-1].m_precomputed_txdata.m_spent_outputs;
LAB_00b2b916:
                p_Var31 = (_Base_ptr)CONCAT44(local_398._4_4_,local_398._0_4_);
                this_01 = this;
                in_stack_fffffffffffff5d8 = pWVar43;
                goto LAB_00b2b920;
              }
              pCVar7 = pWVar25[-1].m_precomputed_txdata.m_spent_outputs.
                       super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              local_3b8[0] = (string)0x0;
              uVar13 = *(undefined8 *)((long)&pCVar7[1].scriptPubKey.super_CScriptBase._union + 9);
              uVar14 = *(undefined8 *)
                        ((long)&pCVar7[1].scriptPubKey.super_CScriptBase._union + 0x11);
              uVar15 = *(undefined8 *)
                        ((long)&pCVar7[1].scriptPubKey.super_CScriptBase._union + 0x19);
              uVar16 = *(undefined8 *)((long)&pCVar7[2].nValue + 1);
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)uVar15;
              local_3a8._M_local_buf[8] = (char)((ulong)uVar15 >> 0x38);
              local_3a8._9_7_ = (undefined7)uVar16;
              local_398[0] = (undefined1)((ulong)uVar16 >> 0x38);
              local_3b8._1_7_ = (undefined7)uVar13;
              local_3b8[8] = (undefined1)((ulong)uVar13 >> 0x38);
              local_3b8._9_3_ = (undefined3)uVar14;
              local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x18);
              local_3a8._M_local_buf[0] = (char)((ulong)uVar14 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)local_3b8);
              if (bVar20) {
                pWVar25 = (pointer)&pWVar25[-1].m_precomputed_txdata.m_spent_outputs.
                                    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage;
                goto LAB_00b2b916;
              }
              lVar26 = *(long *)&((_Rep_type *)&pWVar25->m_conflicts)->_M_impl;
              local_3b8[0] = (string)0x0;
              uVar13 = *(undefined8 *)(lVar26 + 0x41);
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)*(undefined8 *)(lVar26 + 0x49);
              local_3a8._M_local_buf[8] = (char)((ulong)*(undefined8 *)(lVar26 + 0x49) >> 0x38);
              local_3a8._9_7_ = (undefined7)*(undefined8 *)(lVar26 + 0x51);
              local_398[0] = (undefined1)((ulong)*(undefined8 *)(lVar26 + 0x51) >> 0x38);
              local_3b8._1_7_ = (undefined7)*(undefined8 *)(lVar26 + 0x39);
              local_3b8[8] = (undefined1)((ulong)*(undefined8 *)(lVar26 + 0x39) >> 0x38);
              local_3b8._9_3_ = (undefined3)uVar13;
              local_3b8._12_4_ = (undefined4)((ulong)uVar13 >> 0x18);
              local_3a8._M_local_buf[0] = (char)((ulong)uVar13 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)local_3b8);
              if (bVar20) goto LAB_00b2b916;
              p_Var31 = (((_Rep_type *)&pWVar25->m_conflicts)->_M_impl).super__Rb_tree_header.
                        _M_header._M_parent;
              local_3b8[0] = (string)0x0;
              uVar13 = *(undefined8 *)((long)&p_Var31[1]._M_right + 1);
              uVar14 = *(undefined8 *)((long)&p_Var31[2]._M_color + 1);
              uVar15 = *(undefined8 *)((long)&p_Var31[2]._M_parent + 1);
              uVar16 = *(undefined8 *)((long)&p_Var31[2]._M_left + 1);
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)uVar15;
              local_3a8._M_local_buf[8] = (char)((ulong)uVar15 >> 0x38);
              local_3a8._9_7_ = (undefined7)uVar16;
              local_398[0] = (undefined1)((ulong)uVar16 >> 0x38);
              local_3b8._1_7_ = (undefined7)uVar13;
              local_3b8[8] = (undefined1)((ulong)uVar13 >> 0x38);
              local_3b8._9_3_ = (undefined3)uVar14;
              local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x18);
              local_3a8._M_local_buf[0] = (char)((ulong)uVar14 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)local_3b8);
              p_Var31 = (_Base_ptr)CONCAT44(local_398._4_4_,local_398._0_4_);
              if (bVar20) {
                pWVar25 = (pointer)&(((_Rep_type *)&pWVar25->m_conflicts)->_M_impl).
                                    super__Rb_tree_header._M_header._M_parent;
                goto LAB_00b2b916;
              }
              lVar34 = lVar34 + -1;
              pWVar28 = (pointer)&(pWVar25->m_iters_conflicting)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent;
            } while (1 < lVar34);
            pWVar28 = (pointer)&(((_Rep_type *)&pWVar25->m_conflicts)->_M_impl).
                                super__Rb_tree_header._M_header._M_right;
            this_01 = this;
          }
          local_398._4_4_ = (undefined4)((ulong)p_Var31 >> 0x20);
          lVar34 = (long)pWVar43 - (long)pWVar28 >> 4;
          in_stack_fffffffffffff5d8 = pWVar43;
          if (lVar34 == 1) {
LAB_00b2ac8d:
            local_398._4_4_ = (undefined4)((ulong)p_Var31 >> 0x20);
            p_Var8 = *(_Base_ptr *)&((_Rep_type *)&pWVar28->m_conflicts)->_M_impl;
            local_3b8[0] = (string)0x0;
            uVar13 = *(undefined8 *)((long)&p_Var8[1]._M_right + 1);
            uVar14 = *(undefined8 *)((long)&p_Var8[2]._M_color + 1);
            uVar15 = *(undefined8 *)((long)&p_Var8[2]._M_parent + 1);
            uVar16 = *(undefined8 *)((long)&p_Var8[2]._M_left + 1);
            local_3b8._1_7_ = (undefined7)uVar13;
            local_3b8[8] = (undefined1)((ulong)uVar13 >> 0x38);
            local_3b8._9_3_ = (undefined3)uVar14;
            local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x18);
            local_3a8._M_local_buf[0] = (char)((ulong)uVar14 >> 0x38);
            local_3a8._M_allocated_capacity._1_7_ = (undefined7)uVar15;
            local_3a8._M_local_buf[8] = (char)((ulong)uVar15 >> 0x38);
            local_3a8._9_7_ = (undefined7)uVar16;
            local_398._1_3_ = (undefined3)((ulong)p_Var31 >> 8);
            local_398[0] = (undefined1)((ulong)uVar16 >> 0x38);
            bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)local_3b8);
            pWVar25 = pWVar28;
            if (!bVar20) {
              pWVar25 = pWVar43;
            }
LAB_00b2acbb:
            p_Var31 = (_Base_ptr)CONCAT44(local_398._4_4_,local_398._0_4_);
          }
          else {
            if (lVar34 == 2) {
LAB_00b2ac5d:
              local_398._4_4_ = (undefined4)((ulong)p_Var31 >> 0x20);
              p_Var8 = *(_Base_ptr *)&((_Rep_type *)&pWVar28->m_conflicts)->_M_impl;
              local_3b8[0] = (string)0x0;
              uVar13 = *(undefined8 *)((long)&p_Var8[1]._M_right + 1);
              uVar14 = *(undefined8 *)((long)&p_Var8[2]._M_color + 1);
              uVar15 = *(undefined8 *)((long)&p_Var8[2]._M_parent + 1);
              uVar16 = *(undefined8 *)((long)&p_Var8[2]._M_left + 1);
              local_3b8._1_7_ = (undefined7)uVar13;
              local_3b8[8] = (undefined1)((ulong)uVar13 >> 0x38);
              local_3b8._9_3_ = (undefined3)uVar14;
              local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x18);
              local_3a8._M_local_buf[0] = (char)((ulong)uVar14 >> 0x38);
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)uVar15;
              local_3a8._M_local_buf[8] = (char)((ulong)uVar15 >> 0x38);
              local_3a8._9_7_ = (undefined7)uVar16;
              local_398._1_3_ = (undefined3)((ulong)p_Var31 >> 8);
              local_398[0] = (undefined1)((ulong)uVar16 >> 0x38);
              in_stack_fffffffffffff5d8 = pWVar43;
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)local_3b8);
              p_Var31 = (_Base_ptr)CONCAT44(local_398._4_4_,local_398._0_4_);
              pWVar25 = pWVar28;
              if (!bVar20) {
                pWVar28 = (pointer)&(((_Rep_type *)&pWVar28->m_conflicts)->_M_impl).
                                    super__Rb_tree_header._M_header._M_parent;
                goto LAB_00b2ac8d;
              }
              goto LAB_00b2acbb;
            }
            pWVar25 = pWVar43;
            if (lVar34 == 3) {
              p_Var8 = *(_Base_ptr *)&((_Rep_type *)&pWVar28->m_conflicts)->_M_impl;
              local_3b8[0] = (string)0x0;
              uVar13 = *(undefined8 *)((long)&p_Var8[1]._M_right + 1);
              uVar14 = *(undefined8 *)((long)&p_Var8[2]._M_color + 1);
              uVar15 = *(undefined8 *)((long)&p_Var8[2]._M_parent + 1);
              uVar16 = *(undefined8 *)((long)&p_Var8[2]._M_left + 1);
              local_3b8._1_7_ = (undefined7)uVar13;
              local_3b8[8] = (undefined1)((ulong)uVar13 >> 0x38);
              local_3b8._9_3_ = (undefined3)uVar14;
              local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x18);
              local_3a8._M_local_buf[0] = (char)((ulong)uVar14 >> 0x38);
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)uVar15;
              local_3a8._M_local_buf[8] = (char)((ulong)uVar15 >> 0x38);
              local_3a8._9_7_ = (undefined7)uVar16;
              local_398._1_3_ = (undefined3)((ulong)p_Var31 >> 8);
              local_398[0] = (undefined1)((ulong)uVar16 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)local_3b8);
              p_Var31 = (_Base_ptr)CONCAT44(local_398._4_4_,local_398._0_4_);
              pWVar25 = pWVar28;
              in_stack_fffffffffffff5d8 = pWVar43;
              if (!bVar20) {
                pWVar28 = (pointer)&(((_Rep_type *)&pWVar28->m_conflicts)->_M_impl).
                                    super__Rb_tree_header._M_header._M_parent;
                goto LAB_00b2ac5d;
              }
              goto LAB_00b2acbb;
            }
          }
LAB_00b2b920:
          local_398._0_8_ = p_Var31;
          if (pWVar25 != in_stack_fffffffffffff5d8) {
            __assert_fail("std::all_of(txns.cbegin(), txns.cend(), [this](const auto& tx) { return !m_pool.exists(GenTxid::Txid(tx->GetHash()));})"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x479,
                          "bool (anonymous namespace)::MemPoolAccept::PackageMempoolChecks(const std::vector<CTransactionRef> &, std::vector<Workspace> &, const int64_t, PackageValidationState &)"
                         );
          }
          if ((long)(txns->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(txns->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4 != sVar37) {
            __assert_fail("txns.size() == workspaces.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x47b,
                          "bool (anonymous namespace)::MemPoolAccept::PackageMempoolChecks(const std::vector<CTransactionRef> &, std::vector<Workspace> &, const int64_t, PackageValidationState &)"
                         );
          }
          CTxMemPool::CheckPackageLimits((Result<void> *)local_3b8,this->m_pool,txns,iVar30);
          pWVar38 = local_9b8.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pWVar23 = local_9b8.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_388[0x10] == '\x01') {
            if ((this->m_subpackage).m_rbf != true) {
              std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
              ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)local_3b8)
              ;
              __return_storage_ptr___00 =
                   (string *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8);
              pWVar35 = extraout_RDX_02;
              goto LAB_00b2bd17;
            }
            if ((long)local_9b8.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_9b8.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0x480) {
              bVar20 = IsChildWithParents(txns);
              if (bVar20) {
                bVar20 = pWVar23 == pWVar38;
                if (!bVar20) {
                  bVar20 = false;
                  pWVar44 = pWVar23;
                  do {
                    pWVar28 = (pointer)(pWVar44->m_ancestors)._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count;
                    if (pWVar28 != (pointer)0x0) {
                      local_750 = (undefined1  [8])(local_748 + 8);
                      local_e0._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x41;
                      _Var27._M_p = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::_M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_750,(size_type *)local_e0,0);
                      uVar13 = local_e0._0_8_;
                      local_748._8_8_ = local_e0._0_8_;
                      local_750 = (undefined1  [8])_Var27._M_p;
                      memcpy(_Var27._M_p,
                             "package RBF failed: new transaction cannot have mempool ancestors",
                             0x41);
                      local_748._0_8_ = uVar13;
                      _Var27._M_p[uVar13] = '\0';
                      local_e0._0_8_ = local_d0;
                      local_e0._8_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0;
                      local_d0._0_8_ = local_d0._0_8_ & 0xffffffffffffff00;
                      local_a00 = ValidationState<PackageValidationResult>::Invalid
                                            (&local_400,PCKG_POLICY,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_750,(string *)local_e0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e0._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_d0) {
                        operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._0_8_ + 1));
                      }
                      in_stack_fffffffffffff5d8 = pWVar28;
                      if (local_750 != (undefined1  [8])(local_748 + 8)) {
                        operator_delete((void *)local_750,(ulong)(local_748._8_8_ + 1));
                        in_stack_fffffffffffff5d8 = pWVar28;
                      }
                    }
                    if (pWVar28 != (pointer)0x0) break;
                    pWVar44 = pWVar44 + 1;
                    bVar20 = pWVar44 == pWVar38;
                  } while (!bVar20);
                }
                __return_storage_ptr___00 =
                     (string *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8);
                if (!bVar20) goto LAB_00b2bd01;
                local_738._0_8_ = local_748;
                local_748._0_8_ = local_748._0_8_ & 0xffffffff00000000;
                local_748._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                local_728 = (string  [8])0x0;
                pMVar49 = this_01;
                local_738._8_8_ = local_738._0_8_;
                if (pWVar23 != pWVar38) {
                  do {
                    std::_Rb_tree<$270907ca$>::_M_merge_unique<CompareIteratorByHash>
                              ((_Rb_tree<_270907ca_> *)local_750,
                               &(pWVar23->m_iters_conflicting)._M_t);
                    pWVar23 = pWVar23 + 1;
                  } while (pWVar23 != pWVar38);
                }
                pWVar23 = local_9b8.
                          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pWVar28 = (pointer)&(this_01->m_subpackage).m_all_conflicts;
                GetEntriesForConflicts_abi_cxx11_
                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_e0,
                           ((local_9b8.
                             super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_ptx)->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,this_01->m_pool,(setEntries *)local_750,(setEntries *)pWVar28);
                uVar19 = local_d0[0x10];
                if (local_d0[0x10] == '\x01') {
                  local_128 = (undefined1  [8])&local_118;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_128,
                             "package RBF failed: too many potential replacements","");
                  local_a00 = ValidationState<PackageValidationResult>::Invalid
                                        (&local_400,PCKG_POLICY,(string *)local_128,
                                         (string *)local_e0);
                  if (local_128 != (undefined1  [8])&local_118) {
                    operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
                  }
                }
                if ((local_d0[0x10] == '\x01') &&
                   (local_d0[0x10] = '\0',
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_e0._0_8_ !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_d0)) {
                  operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._0_8_ + 1));
                }
                if (uVar19 == '\0') {
                  p_Var31 = (this_01->m_subpackage).m_all_conflicts._M_t._M_impl.
                            super__Rb_tree_header._M_header._M_left;
                  while ((_Rb_tree_header *)p_Var31 !=
                         &(this_01->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header
                        ) {
                    lVar34 = *(long *)(p_Var31 + 1);
                    pCVar1 = &(this_01->m_subpackage).m_conflicting_fees;
                    *pCVar1 = *pCVar1 + *(long *)(lVar34 + 0xa8);
                    iVar30 = GetVirtualTransactionSize
                                       ((long)*(int *)(lVar34 + 0x78),*(int64_t *)(lVar34 + 0xa0),
                                        nBytesPerSigOp);
                    psVar2 = &(this_01->m_subpackage).m_conflicting_size;
                    *psVar2 = *psVar2 + (long)(int)iVar30;
                    p_Var31 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var31);
                  }
                  relay_fee.nSatoshisPerK =
                       (this_01->m_pool->m_opts).incremental_relay_feerate.nSatoshisPerK;
                  PaysForRBF_abi_cxx11_
                            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_e0,(this_01->m_subpackage).m_conflicting_fees,
                             (this_01->m_subpackage).m_total_modified_fees,
                             (this_01->m_subpackage).m_total_vsize,relay_fee,
                             &((((pWVar23[1].m_ptx)->
                                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->hash).m_wrapped);
                  uVar19 = local_d0[0x10];
                  in_stack_fffffffffffff5d8 = pWVar28;
                  if (local_d0[0x10] == '\x01') {
                    local_128 = (undefined1  [8])&local_118;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_128,"package RBF failed: insufficient anti-DoS fees",
                               "");
                    local_a00 = ValidationState<PackageValidationResult>::Invalid
                                          (&local_400,PCKG_POLICY,(string *)local_128,
                                           (string *)local_e0);
                    if (local_128 != (undefined1  [8])&local_118) {
                      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
                    }
                  }
                  if ((local_d0[0x10] == '\x01') &&
                     (local_d0[0x10] = '\0',
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_e0._0_8_ !=
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_d0)) {
                    operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._0_8_ + 1));
                  }
                  if (uVar19 != '\0') goto LAB_00b2d735;
                  CFeeRate::CFeeRate((CFeeRate *)&local_78,&pWVar23->m_modified_fees,
                                     (uint32_t)pWVar23->m_vsize);
                  CFeeRate::CFeeRate(local_98,&replaced_txns_00->m_total_modified_fees,
                                     (uint32_t)(this_01->m_subpackage).m_total_vsize);
                  if (local_78.ancestor_count < local_98[0].nSatoshisPerK) {
                    ImprovesFeerateDiagram_abi_cxx11_
                              ((optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_e0,this_01->m_pool,(setEntries *)local_750,
                               (setEntries *)pWVar28,(this_01->m_subpackage).m_total_modified_fees,
                               (this_01->m_subpackage).m_total_vsize);
                    uVar19 = local_d0[0x18];
                    if (local_d0[0x18] == '\x01') {
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_128,"package RBF failed: ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_e0 + 8));
                      local_168 = (char *)0x0;
                      local_160._M_local_buf[0] = '\0';
                      local_170 = (undefined1  [8])&local_160;
                      local_a00 = ValidationState<PackageValidationResult>::Invalid
                                            (&local_400,PCKG_POLICY,(string *)local_128,
                                             (string *)local_170);
                      if (local_170 != (undefined1  [8])&local_160) {
                        operator_delete((void *)local_170,
                                        CONCAT71(local_160._M_allocated_capacity._1_7_,
                                                 local_160._M_local_buf[0]) + 1);
                      }
                      if (local_128 != (undefined1  [8])&local_118) {
                        operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
                      }
                    }
                    if ((local_d0[0x18] == '\x01') &&
                       (local_d0[0x18] = '\0',
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_e0._8_8_ !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_d0 + 8))) {
                      operator_delete((void *)local_e0._8_8_,(ulong)(local_d0._8_8_ + 1));
                    }
                    __return_storage_ptr___00 =
                         (string *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8);
                    if (uVar19 == '\0') {
                      pLVar29 = LogInstance();
                      bVar20 = BCLog::Logger::WillLogCategoryLevel(pLVar29,TXPACKAGES,Debug);
                      __return_storage_ptr___00 =
                           (string *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8);
                      local_a00 = 1;
                      if (bVar20) {
                        base_blob<256u>::ToString_abi_cxx11_
                                  ((string *)local_e0,
                                   &((((txns->
                                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->hash);
                        base_blob<256u>::ToString_abi_cxx11_
                                  ((string *)local_128,
                                   &((((txns->
                                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->m_witness_hash);
                        __return_storage_ptr___00 = (string *)local_170;
                        base_blob<256u>::ToString_abi_cxx11_
                                  (__return_storage_ptr___00,
                                   &((txns->
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish[-1].
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->hash);
                        in_stack_fffffffffffff5b0 = local_58;
                        base_blob<256u>::ToString_abi_cxx11_
                                  ((string *)in_stack_fffffffffffff5b0,
                                   &((txns->
                                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish[-1].
                                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->m_witness_hash);
                        source_file_00._M_str =
                             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                        ;
                        source_file_00._M_len = 0x57;
                        logging_function._M_str = "PackageMempoolChecks";
                        logging_function._M_len = 0x14;
                        LogPrintf_<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                  (logging_function,source_file_00,(int)local_e0,(LogFlags)local_128
                                   ,(Level)__return_storage_ptr___00,in_stack_fffffffffffff5b0,
                                   in_stack_fffffffffffff5b8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                                   in_stack_fffffffffffff5c8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pMVar49);
                        if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
                          operator_delete((void *)local_58._0_8_,
                                          CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
                        }
                        if (local_170 != (undefined1  [8])&local_160) {
                          operator_delete((void *)local_170,
                                          CONCAT71(local_160._M_allocated_capacity._1_7_,
                                                   local_160._M_local_buf[0]) + 1);
                        }
                        if (local_128 != (undefined1  [8])&local_118) {
                          operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_e0._0_8_ !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_d0) {
                          operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._0_8_ + 1));
                        }
                        local_a00 = 1;
                      }
                    }
                  }
                  else {
                    local_e0._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_d0;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_e0,
                               "package RBF failed: package feerate is less than or equal to parent feerate"
                               ,"");
                    local_978.
                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)CONCAT44(local_978.
                                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
                    CFeeRate::ToString_abi_cxx11_
                              ((string *)local_170,local_98,(FeeEstimateMode *)&local_978);
                    local_980 = CONCAT44(local_980._4_4_,3);
                    CFeeRate::ToString_abi_cxx11_
                              ((string *)local_58,(CFeeRate *)&local_78,
                               (FeeEstimateMode *)&local_980);
                    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                              ((string *)local_128,
                               (tinyformat *)"package feerate %s <= parent feerate is %s",local_170,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)relay_fee.nSatoshisPerK);
                    local_a00 = ValidationState<PackageValidationResult>::Invalid
                                          (&local_400,PCKG_POLICY,(string *)local_e0,
                                           (string *)local_128);
                    if (local_128 != (undefined1  [8])&local_118) {
                      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
                    }
                    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
                      operator_delete((void *)local_58._0_8_,
                                      CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
                    }
                    if (local_170 != (undefined1  [8])&local_160) {
                      operator_delete((void *)local_170,
                                      CONCAT71(local_160._M_allocated_capacity._1_7_,
                                               local_160._M_local_buf[0]) + 1);
                    }
                    __return_storage_ptr___00 =
                         (string *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_e0._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0) {
                      operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._0_8_ + 1));
                      __return_storage_ptr___00 =
                           (string *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8);
                    }
                  }
                }
                else {
LAB_00b2d735:
                  __return_storage_ptr___00 =
                       (string *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8);
                }
                std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)local_750);
                this_01 = pMVar49;
                goto LAB_00b2bd01;
              }
            }
            local_e0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x34;
            local_750 = (undefined1  [8])(local_748 + 8);
            local_750 = (undefined1  [8])
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_750,(size_type *)local_e0,0);
            local_748._8_8_ = local_e0._0_8_;
            builtin_strncpy((char *)local_750,"package RBF failed: package must be 1-parent-1-child"
                            ,0x34);
            local_748._0_8_ = local_e0._0_8_;
            *(char *)((long)local_750 + local_e0._0_8_) = '\0';
            local_e0._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_d0._0_8_ = local_d0._0_8_ & 0xffffffffffffff00;
            local_e0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d0;
            local_a00 = ValidationState<PackageValidationResult>::Invalid
                                  (&local_400,PCKG_POLICY,(string *)local_750,(string *)local_e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0) {
              operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._0_8_ + 1));
            }
            __return_storage_ptr___00 =
                 (string *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8);
            paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_748._8_8_;
            _Var27._M_p = (pointer)local_750;
            if (local_750 != (undefined1  [8])(local_748 + 8)) {
LAB_00b2bcf9:
              operator_delete(_Var27._M_p,(ulong)((long)paVar39 + 1));
              __return_storage_ptr___00 =
                   (string *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8);
            }
          }
          else {
            local_750 = (undefined1  [8])0x16;
            local_e0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d0;
            local_e0._0_8_ =
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,(size_type *)local_750,0);
            local_d0._0_8_ = local_750;
            *(undefined8 *)local_e0._0_8_ = 0x2d6567616b636170;
            *(char *)(local_e0._0_8_ + 8) = 'm';
            *(char *)(local_e0._0_8_ + 9) = 'e';
            *(char *)(local_e0._0_8_ + 10) = 'm';
            *(char *)(local_e0._0_8_ + 0xb) = 'p';
            *(char *)(local_e0._0_8_ + 0xc) = 'o';
            *(char *)(local_e0._0_8_ + 0xd) = 'o';
            *(char *)(local_e0._0_8_ + 0xe) = 'l';
            *(char *)(local_e0._0_8_ + 0xf) = '-';
            *(char *)(local_e0._0_8_ + 0xe) = 'l';
            *(char *)(local_e0._0_8_ + 0xf) = '-';
            *(char *)(local_e0._0_8_ + 0x10) = 'l';
            *(char *)(local_e0._0_8_ + 0x11) = 'i';
            *(char *)(local_e0._0_8_ + 0x12) = 'm';
            *(char *)(local_e0._0_8_ + 0x13) = 'i';
            *(char *)(local_e0._0_8_ + 0x14) = 't';
            *(char *)(local_e0._0_8_ + 0x15) = 's';
            local_e0._8_8_ = local_750;
            *(char *)(local_e0._0_8_ + (long)local_750) = '\0';
            util::ErrorString<void>((bilingual_str *)local_750,(Result<void> *)local_3b8);
            local_a00 = ValidationState<PackageValidationResult>::Invalid
                                  (&local_400,PCKG_POLICY,(string *)local_e0,(string *)local_750);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_738._8_8_ != &local_720) {
              operator_delete((void *)local_738._8_8_,(ulong)(local_720._M_allocated_capacity + 1));
            }
            if (local_750 != (undefined1  [8])(local_748 + 8)) {
              operator_delete((void *)local_750,(ulong)(local_748._8_8_ + 1));
            }
            __return_storage_ptr___00 =
                 (string *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8);
            paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d0._0_8_;
            _Var27._M_p = (pointer)local_e0._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0) goto LAB_00b2bcf9;
          }
LAB_00b2bd01:
          std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
          ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)local_3b8);
          pWVar35 = extraout_RDX_03;
          if ((local_a00 & 1) == 0) {
            local_7e0._0_4_ = local_400.m_mode;
            local_7e0._4_4_ = local_400.m_result;
            plVar46 = local_7c8;
            local_7d8 = plVar46;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_7d8,local_400.m_reject_reason._M_dataplus._M_p,
                       local_400.m_reject_reason._M_dataplus._M_p +
                       local_400.m_reject_reason._M_string_length);
            local_7b8[0] = local_7a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_7b8,local_400.m_debug_message._M_dataplus._M_p,
                       local_400.m_debug_message._M_dataplus._M_p +
                       local_400.m_debug_message._M_string_length);
            state_10.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p
                 = in_stack_fffffffffffff5b0;
            state_10.super_ValidationState<PackageValidationResult>._0_8_ =
                 __return_storage_ptr___00;
            state_10.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
                 = (size_type)in_stack_fffffffffffff5b8;
            state_10.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
            state_10.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
            state_10.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
                 in_stack_fffffffffffff5c8;
            state_10.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
                 = (pointer)this_01;
            state_10.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length
                 = (size_type)in_stack_fffffffffffff5d8;
            state_10.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity._0_4_ = (int)replaced_txns_00;
            state_10.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity._4_4_ = (int)((ulong)replaced_txns_00 >> 0x20);
            state_10.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
                 args;
            PackageMempoolAcceptResult::PackageMempoolAcceptResult
                      (__return_storage_ptr__,state_10,
                       (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)local_7e0);
            plVar42 = local_7d8;
            if (local_7b8[0] != local_7a8) {
              operator_delete(local_7b8[0],local_7a8[0] + 1);
              plVar42 = local_7d8;
            }
            goto LAB_00b2d390;
          }
        }
LAB_00b2bd17:
        pWVar23 = local_9b8.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (local_9b8.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_9b8.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          replaced_txns_00 = (SubPackageState *)&(this_01->m_subpackage).m_replaced_transactions;
          pWVar38 = local_9b8.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            (pWVar38->m_package_feerate).nSatoshisPerK = local_9c0.nSatoshisPerK;
            bVar20 = PolicyScriptChecks(this_01,(ATMPArgs *)pWVar38,pWVar35);
            if (bVar20) {
              pWVar35 = extraout_RDX_04;
              if (args->m_test_accept == true) {
                if (args->m_package_feerates == true) {
                  local_e0._0_8_ = (pWVar38->m_package_feerate).nSatoshisPerK;
                }
                else {
                  CFeeRate::CFeeRate((CFeeRate *)local_e0,&pWVar38->m_modified_fees,
                                     (uint32_t)pWVar38->m_vsize);
                }
                if (args->m_package_feerates == true) {
                  std::
                  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ::vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)local_750,&local_9d8);
                }
                else {
                  peVar6 = (pWVar38->m_ptx->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  uVar13 = *(undefined8 *)
                            (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                  ;
                  uVar14 = *(undefined8 *)
                            ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 8);
                  uVar15 = *(undefined8 *)
                            ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 0x10);
                  uVar16 = *(undefined8 *)
                            ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 0x18);
                  local_3a8._M_local_buf[0] = (char)uVar15;
                  local_3a8._M_allocated_capacity._1_7_ = (undefined7)((ulong)uVar15 >> 8);
                  local_3a8._M_local_buf[8] = (char)uVar16;
                  local_3a8._9_7_ = (undefined7)((ulong)uVar16 >> 8);
                  local_3b8[0] = (undefined1)uVar13;
                  local_3b8._1_7_ = (undefined7)((ulong)uVar13 >> 8);
                  local_3b8._8_4_ = (undefined4)uVar14;
                  local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x20);
                  __l_00._M_len = 1;
                  __l_00._M_array = (iterator)local_3b8;
                  std::
                  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ::vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)local_750,__l_00,&local_9e1);
                }
                peVar6 = (pWVar38->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                MempoolAcceptResult::MempoolAcceptResult
                          ((MempoolAcceptResult *)local_3b8,
                           (list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)replaced_txns_00,pWVar38->m_vsize,pWVar38->m_base_fees,
                           (CFeeRate)local_e0._0_8_,
                           (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)local_750);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&local_478,&peVar6->m_witness_hash,(MempoolAcceptResult *)local_3b8);
                if (local_308 == true) {
                  local_308 = false;
                  pvVar17 = (void *)CONCAT71(local_320._1_7_,local_320._0_1_);
                  if (pvVar17 != (void *)0x0) {
                    operator_delete(pvVar17,(long)local_320._M_value.
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)pvVar17);
                  }
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_368);
                pWVar35 = extraout_RDX_07;
                if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                  operator_delete((void *)local_388._0_8_,(ulong)(local_388._16_8_ + 1));
                  pWVar35 = extraout_RDX_08;
                }
                if ((undefined1 *)
                    CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0]) !=
                    local_398) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                           local_3a8._M_local_buf[0]),
                                  (ulong)((long)&((_Base_ptr)local_398._0_8_)->_M_color + 1));
                  pWVar35 = extraout_RDX_09;
                }
                if (local_750 != (undefined1  [8])0x0) {
                  uVar40 = local_748._8_8_ - (long)local_750;
                  _Var27._M_p = (pointer)local_750;
                  goto LAB_00b2c1ec;
                }
              }
            }
            else {
              local_3b8[0] = SUB81(&local_3a8,0);
              local_3b8._1_7_ = (undefined7)((ulong)&local_3a8 >> 8);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3b8,"transaction failed","");
              local_750 = (undefined1  [8])(local_748 + 8);
              std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"");
              ValidationState<PackageValidationResult>::Invalid
                        (&local_400,PCKG_TX,(string *)local_3b8,(string *)local_750);
              if (local_750 != (undefined1  [8])(local_748 + 8)) {
                operator_delete((void *)local_750,(ulong)(local_748._8_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_3b8._1_7_,local_3b8[0]) != &local_3a8) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_3b8._1_7_,local_3b8[0]),
                                CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                         local_3a8._M_local_buf[0]) + 1);
              }
              peVar6 = (pWVar38->m_ptx->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_828._0_4_ = (pWVar38->m_state).super_ValidationState<TxValidationResult>.m_mode;
              local_828._4_4_ =
                   (pWVar38->m_state).super_ValidationState<TxValidationResult>.m_result;
              local_820[0] = local_810;
              pcVar41 = (pWVar38->m_state).super_ValidationState<TxValidationResult>.m_reject_reason
                        ._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_820,pcVar41,
                         pcVar41 + (pWVar38->m_state).super_ValidationState<TxValidationResult>.
                                   m_reject_reason._M_string_length);
              local_800[0] = local_7f0;
              pcVar41 = (pWVar38->m_state).super_ValidationState<TxValidationResult>.m_debug_message
                        ._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_800,pcVar41,
                         pcVar41 + (pWVar38->m_state).super_ValidationState<TxValidationResult>.
                                   m_debug_message._M_string_length);
              state_07.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
                   in_stack_fffffffffffff5b0;
              state_07.super_ValidationState<TxValidationResult>._0_8_ = __return_storage_ptr___00;
              state_07.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
                   (size_type)in_stack_fffffffffffff5b8;
              state_07.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
              _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
              state_07.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
              _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
              state_07.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
                   in_stack_fffffffffffff5c8;
              state_07.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
                   (pointer)this_01;
              state_07.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
                   (size_type)in_stack_fffffffffffff5d8;
              state_07.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
              _M_allocated_capacity._0_4_ = (int)replaced_txns_00;
              state_07.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
              _M_allocated_capacity._4_4_ = (int)((ulong)replaced_txns_00 >> 0x20);
              state_07.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                   args;
              MempoolAcceptResult::Failure((MempoolAcceptResult *)local_3b8,state_07);
              std::
              _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
              ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                        ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                          *)&local_478,&peVar6->m_witness_hash,(MempoolAcceptResult *)local_3b8);
              if (local_308 == true) {
                local_308 = false;
                pvVar17 = (void *)CONCAT71(local_320._1_7_,local_320._0_1_);
                if (pvVar17 != (void *)0x0) {
                  operator_delete(pvVar17,(long)local_320._M_value.
                                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)pvVar17);
                }
              }
              std::__cxx11::
              _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)local_368);
              if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                operator_delete((void *)local_388._0_8_,(ulong)(local_388._16_8_ + 1));
              }
              if ((undefined1 *)
                  CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0]) !=
                  local_398) {
                operator_delete((undefined1 *)
                                CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                         local_3a8._M_local_buf[0]),
                                (ulong)((long)&((_Base_ptr)local_398._0_8_)->_M_color + 1));
              }
              if (local_800[0] != local_7f0) {
                operator_delete(local_800[0],local_7f0[0] + 1);
              }
              if (local_820[0] != local_810) {
                operator_delete(local_820[0],local_810[0] + 1);
              }
              local_870._0_4_ = local_400.m_mode;
              local_870._4_4_ = local_400.m_result;
              local_868 = &local_858;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_868,local_400.m_reject_reason._M_dataplus._M_p,
                         local_400.m_reject_reason._M_dataplus._M_p +
                         local_400.m_reject_reason._M_string_length);
              local_848[0] = local_838;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_848,local_400.m_debug_message._M_dataplus._M_p,
                         local_400.m_debug_message._M_dataplus._M_p +
                         local_400.m_debug_message._M_string_length);
              state_08.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
              _M_p = in_stack_fffffffffffff5b0;
              state_08.super_ValidationState<PackageValidationResult>._0_8_ =
                   __return_storage_ptr___00;
              state_08.super_ValidationState<PackageValidationResult>.m_reject_reason.
              _M_string_length = (size_type)in_stack_fffffffffffff5b8;
              state_08.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
              _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
              state_08.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
              _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
              state_08.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_
                   = in_stack_fffffffffffff5c8;
              state_08.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus.
              _M_p = (pointer)this_01;
              state_08.super_ValidationState<PackageValidationResult>.m_debug_message.
              _M_string_length = (size_type)in_stack_fffffffffffff5d8;
              state_08.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
              _M_allocated_capacity._0_4_ = (int)replaced_txns_00;
              state_08.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
              _M_allocated_capacity._4_4_ = (int)((ulong)replaced_txns_00 >> 0x20);
              state_08.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_
                   = args;
              PackageMempoolAcceptResult::PackageMempoolAcceptResult
                        (__return_storage_ptr__,state_08,
                         (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                          *)local_870);
              pWVar35 = extraout_RDX_05;
              if (local_848[0] != local_838) {
                operator_delete(local_848[0],local_838[0] + 1);
                pWVar35 = extraout_RDX_06;
              }
              if (local_868 != &local_858) {
                uVar40 = local_858._M_allocated_capacity + 1;
                _Var27._M_p = (pointer)local_868;
LAB_00b2c1ec:
                operator_delete(_Var27._M_p,uVar40);
                pWVar35 = extraout_RDX_10;
              }
            }
            if (!bVar20) goto LAB_00b2d3a0;
            pWVar38 = pWVar38 + 1;
          } while (pWVar38 != pWVar23);
        }
        pWVar28 = local_9b8.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pWVar23 = local_9b8.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (args->m_test_accept == true) {
          local_8b8._0_4_ = local_400.m_mode;
          local_8b8._4_4_ = local_400.m_result;
          plVar46 = local_8a0;
          local_8b0 = plVar46;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_8b0,local_400.m_reject_reason._M_dataplus._M_p,
                     local_400.m_reject_reason._M_dataplus._M_p +
                     local_400.m_reject_reason._M_string_length);
          local_890[0] = local_880;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_890,local_400.m_debug_message._M_dataplus._M_p,
                     local_400.m_debug_message._M_dataplus._M_p +
                     local_400.m_debug_message._M_string_length);
          state_09.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
               in_stack_fffffffffffff5b0;
          state_09.super_ValidationState<PackageValidationResult>._0_8_ = __return_storage_ptr___00;
          state_09.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
               (size_type)in_stack_fffffffffffff5b8;
          state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
          state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
          state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
               in_stack_fffffffffffff5c8;
          state_09.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
               (pointer)this_01;
          state_09.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
               (size_type)in_stack_fffffffffffff5d8;
          state_09.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity._0_4_ = (int)replaced_txns_00;
          state_09.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity._4_4_ = (int)((ulong)replaced_txns_00 >> 0x20);
          state_09.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
               args;
          PackageMempoolAcceptResult::PackageMempoolAcceptResult
                    (__return_storage_ptr__,state_09,
                     (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      *)local_8b8);
          plVar42 = local_8b0;
          if (local_890[0] != local_880) {
            operator_delete(local_890[0],local_880[0] + 1);
            plVar42 = local_8b0;
          }
        }
        else {
          limits = (Limits *)0x8e38e38e38e38e39;
          lVar34 = ((long)local_9b8.
                          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_9b8.
                          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 6) * -0x71c71c71c71c71c7 >> 2
          ;
          pWVar38 = local_9b8.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          p_Var31 = (_Base_ptr)local_398._0_8_;
          if (0 < lVar34) {
            lVar34 = lVar34 + 1;
            pWVar43 = local_9b8.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2;
            do {
              pWVar25 = pWVar43;
              local_398._4_4_ = (undefined4)((ulong)p_Var31 >> 0x20);
              peVar6 = ((pWVar25[-2].m_ptx)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_3b8[0] = (string)0x0;
              uVar13 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar14 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)uVar15;
              local_3a8._M_local_buf[8] = (char)((ulong)uVar15 >> 0x38);
              local_3a8._9_7_ = (undefined7)uVar16;
              local_398._1_3_ = (undefined3)((ulong)p_Var31 >> 8);
              local_398[0] = (undefined1)((ulong)uVar16 >> 0x38);
              local_3b8._1_7_ = (undefined7)uVar13;
              local_3b8[8] = (undefined1)((ulong)uVar13 >> 0x38);
              local_3b8._9_3_ = (undefined3)uVar14;
              local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x18);
              local_3a8._M_local_buf[0] = (char)((ulong)uVar14 >> 0x38);
              bVar20 = CTxMemPool::exists(this_01->m_pool,(GenTxid *)local_3b8);
              lVar26 = CONCAT71(extraout_var,bVar20);
              if (bVar20) {
                pWVar25 = pWVar25 + -2;
                pWVar35 = extraout_RDX_11;
                p_Var31 = (_Base_ptr)CONCAT44(local_398._4_4_,local_398._0_4_);
                goto LAB_00b2c5d9;
              }
              peVar6 = ((pWVar25[-1].m_ptx)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_3b8[0] = (string)0x0;
              uVar13 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar14 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)uVar15;
              local_3a8._M_local_buf[8] = (char)((ulong)uVar15 >> 0x38);
              local_3a8._9_7_ = (undefined7)uVar16;
              local_398[0] = (undefined1)((ulong)uVar16 >> 0x38);
              local_3b8._1_7_ = (undefined7)uVar13;
              local_3b8[8] = (undefined1)((ulong)uVar13 >> 0x38);
              local_3b8._9_3_ = (undefined3)uVar14;
              local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x18);
              local_3a8._M_local_buf[0] = (char)((ulong)uVar14 >> 0x38);
              bVar20 = CTxMemPool::exists(this_01->m_pool,(GenTxid *)local_3b8);
              lVar26 = CONCAT71(extraout_var_00,bVar20);
              if (bVar20) {
                pWVar25 = pWVar25 + -1;
                pWVar35 = extraout_RDX_12;
                p_Var31 = (_Base_ptr)CONCAT44(local_398._4_4_,local_398._0_4_);
                goto LAB_00b2c5d9;
              }
              peVar6 = (pWVar25->m_ptx->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_3b8[0] = (string)0x0;
              uVar13 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar14 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)uVar15;
              local_3a8._M_local_buf[8] = (char)((ulong)uVar15 >> 0x38);
              local_3a8._9_7_ = (undefined7)uVar16;
              local_398[0] = (undefined1)((ulong)uVar16 >> 0x38);
              local_3b8._1_7_ = (undefined7)uVar13;
              local_3b8[8] = (undefined1)((ulong)uVar13 >> 0x38);
              local_3b8._9_3_ = (undefined3)uVar14;
              local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x18);
              local_3a8._M_local_buf[0] = (char)((ulong)uVar14 >> 0x38);
              bVar20 = CTxMemPool::exists(this_01->m_pool,(GenTxid *)local_3b8);
              lVar26 = CONCAT71(extraout_var_01,bVar20);
              pWVar35 = extraout_RDX_13;
              p_Var31 = (_Base_ptr)CONCAT44(local_398._4_4_,local_398._0_4_);
              if (bVar20) goto LAB_00b2c5d9;
              peVar6 = ((pWVar25[1].m_ptx)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_3b8[0] = (string)0x0;
              uVar13 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar14 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)uVar15;
              local_3a8._M_local_buf[8] = (char)((ulong)uVar15 >> 0x38);
              local_3a8._9_7_ = (undefined7)uVar16;
              local_398[0] = (undefined1)((ulong)uVar16 >> 0x38);
              local_3b8._1_7_ = (undefined7)uVar13;
              local_3b8[8] = (undefined1)((ulong)uVar13 >> 0x38);
              local_3b8._9_3_ = (undefined3)uVar14;
              local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x18);
              local_3a8._M_local_buf[0] = (char)((ulong)uVar14 >> 0x38);
              bVar20 = CTxMemPool::exists(this_01->m_pool,(GenTxid *)local_3b8);
              p_Var31 = (_Base_ptr)CONCAT44(local_398._4_4_,local_398._0_4_);
              lVar26 = CONCAT71(extraout_var_02,bVar20);
              pWVar35 = extraout_RDX_14;
              if (bVar20) {
                pWVar25 = pWVar25 + 1;
                goto LAB_00b2c5d9;
              }
              lVar34 = lVar34 + -1;
              pWVar43 = pWVar25 + 4;
            } while (1 < lVar34);
            pWVar38 = pWVar25 + 2;
          }
          local_398._4_4_ = (undefined4)((ulong)p_Var31 >> 0x20);
          limits = (Limits *)0x8e38e38e38e38e39;
          lVar26 = ((long)pWVar28 - (long)pWVar38 >> 6) * -0x71c71c71c71c71c7;
          pMVar49 = this_01;
          if (lVar26 == 1) {
LAB_00b2c599:
            local_398._4_4_ = (undefined4)((ulong)p_Var31 >> 0x20);
            peVar6 = (pWVar38->m_ptx->
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_3b8[0] = (string)0x0;
            uVar13 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            uVar14 = *(undefined8 *)
                      ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            uVar15 = *(undefined8 *)
                      ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            uVar16 = *(undefined8 *)
                      ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            local_3b8._1_7_ = (undefined7)uVar13;
            local_3b8[8] = (undefined1)((ulong)uVar13 >> 0x38);
            local_3b8._9_3_ = (undefined3)uVar14;
            local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x18);
            local_3a8._M_local_buf[0] = (char)((ulong)uVar14 >> 0x38);
            local_3a8._M_allocated_capacity._1_7_ = (undefined7)uVar15;
            local_3a8._M_local_buf[8] = (char)((ulong)uVar15 >> 0x38);
            local_3a8._9_7_ = (undefined7)uVar16;
            local_398._1_3_ = (undefined3)((ulong)p_Var31 >> 8);
            local_398[0] = (undefined1)((ulong)uVar16 >> 0x38);
            bVar20 = CTxMemPool::exists(this_01->m_pool,(GenTxid *)local_3b8);
            lVar26 = CONCAT71(extraout_var_05,bVar20);
            pWVar35 = extraout_RDX_17;
            pWVar25 = pWVar38;
            if (!bVar20) {
              pWVar25 = pWVar28;
            }
LAB_00b2c5cd:
            this_01 = pMVar49;
            p_Var31 = (_Base_ptr)CONCAT44(local_398._4_4_,local_398._0_4_);
          }
          else {
            if (lVar26 == 2) {
LAB_00b2c498:
              local_398._4_4_ = (undefined4)((ulong)p_Var31 >> 0x20);
              peVar6 = (pWVar38->m_ptx->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_3b8[0] = (string)0x0;
              uVar13 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar14 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              local_3b8._1_7_ = (undefined7)uVar13;
              local_3b8[8] = (undefined1)((ulong)uVar13 >> 0x38);
              local_3b8._9_3_ = (undefined3)uVar14;
              local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x18);
              local_3a8._M_local_buf[0] = (char)((ulong)uVar14 >> 0x38);
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)uVar15;
              local_3a8._M_local_buf[8] = (char)((ulong)uVar15 >> 0x38);
              local_3a8._9_7_ = (undefined7)uVar16;
              local_398._1_3_ = (undefined3)((ulong)p_Var31 >> 8);
              local_398[0] = (undefined1)((ulong)uVar16 >> 0x38);
              bVar20 = CTxMemPool::exists(this_01->m_pool,(GenTxid *)local_3b8);
              p_Var31 = (_Base_ptr)CONCAT44(local_398._4_4_,local_398._0_4_);
              lVar26 = CONCAT71(extraout_var_04,bVar20);
              pWVar35 = extraout_RDX_16;
              pWVar25 = pWVar38;
              if (!bVar20) {
                pWVar38 = pWVar38 + 1;
                goto LAB_00b2c599;
              }
              goto LAB_00b2c5cd;
            }
            pWVar25 = pWVar28;
            if (lVar26 == 3) {
              peVar6 = (pWVar38->m_ptx->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_3b8[0] = (string)0x0;
              uVar13 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar14 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              local_3b8._1_7_ = (undefined7)uVar13;
              local_3b8[8] = (undefined1)((ulong)uVar13 >> 0x38);
              local_3b8._9_3_ = (undefined3)uVar14;
              local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x18);
              local_3a8._M_local_buf[0] = (char)((ulong)uVar14 >> 0x38);
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)uVar15;
              local_3a8._M_local_buf[8] = (char)((ulong)uVar15 >> 0x38);
              local_3a8._9_7_ = (undefined7)uVar16;
              local_398._1_3_ = (undefined3)((ulong)p_Var31 >> 8);
              local_398[0] = (undefined1)((ulong)uVar16 >> 0x38);
              bVar20 = CTxMemPool::exists(this_01->m_pool,(GenTxid *)local_3b8);
              p_Var31 = (_Base_ptr)CONCAT44(local_398._4_4_,local_398._0_4_);
              lVar26 = CONCAT71(extraout_var_03,bVar20);
              pWVar35 = extraout_RDX_15;
              pWVar25 = pWVar38;
              if (!bVar20) {
                pWVar38 = pWVar38 + 1;
                goto LAB_00b2c498;
              }
              goto LAB_00b2c5cd;
            }
          }
LAB_00b2c5d9:
          local_398._0_8_ = p_Var31;
          uVar51 = (undefined4)((ulong)replaced_txns_00 >> 0x20);
          if (pWVar25 != pWVar28) {
            __assert_fail("std::all_of(workspaces.cbegin(), workspaces.cend(), [this](const auto& ws){ return !m_pool.exists(GenTxid::Txid(ws.m_ptx->GetHash())); })"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x54b,
                          "bool (anonymous namespace)::MemPoolAccept::SubmitPackage(const ATMPArgs &, std::vector<Workspace> &, PackageValidationState &, std::map<uint256, MempoolAcceptResult> &)"
                         );
          }
          uVar32 = (undefined7)((ulong)lVar26 >> 8);
          if (pWVar23 == pWVar28) {
            uVar50 = (uint)CONCAT71(uVar32,1);
            pWVar28 = in_stack_fffffffffffff5d8;
          }
          else {
            pcVar41 = local_58 + 0x10;
            uVar50 = (uint)CONCAT71(uVar32,1);
            do {
              bVar20 = ConsensusScriptChecks(this_01,(ATMPArgs *)pWVar23,pWVar35);
              if (!bVar20) {
                peVar6 = (pWVar23->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                local_750 = *(undefined1 (*) [8])
                             &(pWVar23->m_state).super_ValidationState<TxValidationResult>;
                local_748._0_8_ = local_738;
                pcVar9 = (pWVar23->m_state).super_ValidationState<TxValidationResult>.
                         m_reject_reason._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_748,pcVar9,
                           pcVar9 + (pWVar23->m_state).super_ValidationState<TxValidationResult>.
                                    m_reject_reason._M_string_length);
                local_728 = (string  [8])(local_720._M_local_buf + 8);
                pcVar9 = (pWVar23->m_state).super_ValidationState<TxValidationResult>.
                         m_debug_message._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          (local_728,pcVar9,
                           pcVar9 + (pWVar23->m_state).super_ValidationState<TxValidationResult>.
                                    m_debug_message._M_string_length);
                state_11.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
                     = in_stack_fffffffffffff5b0;
                state_11.super_ValidationState<TxValidationResult>._0_8_ = __return_storage_ptr___00
                ;
                state_11.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length
                     = (size_type)in_stack_fffffffffffff5b8;
                state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
                state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
                state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
                     in_stack_fffffffffffff5c8;
                state_11.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p
                     = (pointer)this_01;
                state_11.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length
                     = (size_type)pWVar28;
                state_11.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity._0_4_ = uVar50;
                state_11.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity._4_4_ = uVar51;
                state_11.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                     args;
                MempoolAcceptResult::Failure((MempoolAcceptResult *)local_3b8,state_11);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&local_478,&peVar6->m_witness_hash,(MempoolAcceptResult *)local_3b8);
                if (local_308 == true) {
                  local_308 = false;
                  pvVar17 = (void *)CONCAT71(local_320._1_7_,local_320._0_1_);
                  if (pvVar17 != (void *)0x0) {
                    operator_delete(pvVar17,(long)local_320._M_value.
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)pvVar17);
                  }
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_368);
                if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                  operator_delete((void *)local_388._0_8_,(ulong)(local_388._16_8_ + 1));
                }
                if ((undefined1 *)
                    CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0]) !=
                    local_398) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                           local_3a8._M_local_buf[0]),
                                  (ulong)((long)&((_Base_ptr)local_398._0_8_)->_M_color + 1));
                }
                if (local_728 != (string  [8])(local_720._M_local_buf + 8)) {
                  operator_delete((void *)local_728,local_720._8_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_748._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_738) {
                  operator_delete((void *)local_748._0_8_,local_738._0_8_ + 1);
                }
                base_blob<256u>::ToString_abi_cxx11_
                          ((string *)local_e0,
                           &((pWVar23->m_ptx->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->hash);
                tinyformat::format<std::__cxx11::string>
                          ((string *)local_3b8,
                           (tinyformat *)
                           "BUG! PolicyScriptChecks succeeded but ConsensusScriptChecks failed: %s",
                           (char *)local_e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           limits);
                local_58._8_8_ = (pointer)0x0;
                local_58[0x10] = '\0';
                local_58._0_8_ = pcVar41;
                ValidationState<PackageValidationResult>::Invalid
                          (&local_400,PCKG_MEMPOOL_ERROR,(string *)local_3b8,(string *)local_58);
                if ((pointer)local_58._0_8_ != pcVar41) {
                  operator_delete((void *)local_58._0_8_,
                                  CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_3b8._1_7_,local_3b8[0]) != &local_3a8) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_3b8._1_7_,local_3b8[0]),
                                  CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                           local_3a8._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0) {
                  operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._0_8_ + 1));
                }
                uVar50 = 0;
              }
              limits = &(this_01->m_pool->m_opts).limits;
              CTxMemPool::CalculateMemPoolAncestors
                        ((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                          *)local_e0,this_01->m_pool,
                         (pWVar23->m_entry)._M_t.
                         super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>
                         .super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl,limits,true);
              if (local_a0 != '\x01') {
                peVar6 = (pWVar23->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                local_128 = *(undefined1 (*) [8])
                             &(pWVar23->m_state).super_ValidationState<TxValidationResult>;
                local_120 = local_118._M_local_buf + 8;
                pcVar9 = (pWVar23->m_state).super_ValidationState<TxValidationResult>.
                         m_reject_reason._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_120,pcVar9,
                           pcVar9 + (pWVar23->m_state).super_ValidationState<TxValidationResult>.
                                    m_reject_reason._M_string_length);
                local_100[0] = local_f0;
                pcVar9 = (pWVar23->m_state).super_ValidationState<TxValidationResult>.
                         m_debug_message._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_100,pcVar9,
                           pcVar9 + (pWVar23->m_state).super_ValidationState<TxValidationResult>.
                                    m_debug_message._M_string_length);
                state_12.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
                     = in_stack_fffffffffffff5b0;
                state_12.super_ValidationState<TxValidationResult>._0_8_ = __return_storage_ptr___00
                ;
                state_12.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length
                     = (size_type)in_stack_fffffffffffff5b8;
                state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
                state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
                state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
                     in_stack_fffffffffffff5c8;
                state_12.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p
                     = (pointer)this_01;
                state_12.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length
                     = (size_type)pWVar28;
                state_12.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity._0_4_ = uVar50;
                state_12.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity._4_4_ = uVar51;
                state_12.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                     args;
                MempoolAcceptResult::Failure((MempoolAcceptResult *)local_3b8,state_12);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&local_478,&peVar6->m_witness_hash,(MempoolAcceptResult *)local_3b8);
                if (local_308 == true) {
                  local_308 = false;
                  pvVar17 = (void *)CONCAT71(local_320._1_7_,local_320._0_1_);
                  if (pvVar17 != (void *)0x0) {
                    operator_delete(pvVar17,(long)local_320._M_value.
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)pvVar17);
                  }
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_368);
                if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                  operator_delete((void *)local_388._0_8_,(ulong)(local_388._16_8_ + 1));
                }
                if ((undefined1 *)
                    CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0]) !=
                    local_398) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                           local_3a8._M_local_buf[0]),
                                  (ulong)((long)&((_Base_ptr)local_398._0_8_)->_M_color + 1));
                }
                if (local_100[0] != local_f0) {
                  operator_delete(local_100[0],local_f0[0] + 1);
                }
                if (local_120 != local_118._M_local_buf + 8) {
                  operator_delete(local_120,local_118._8_8_ + 1);
                }
                base_blob<256u>::ToString_abi_cxx11_
                          ((string *)local_58,
                           &((pWVar23->m_ptx->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->hash);
                tinyformat::format<std::__cxx11::string>
                          ((string *)local_3b8,
                           (tinyformat *)
                           "BUG! Mempool ancestors or descendants were underestimated: %s",
                           (char *)local_58,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           limits);
                local_78.ancestor_size_vbytes = 0;
                local_78.descendant_count._0_1_ = 0;
                limits = &local_78;
                local_78.ancestor_count = (int64_t)&local_78.descendant_count;
                ValidationState<PackageValidationResult>::Invalid
                          (&local_400,PCKG_MEMPOOL_ERROR,(string *)local_3b8,(string *)limits);
                if ((int64_t *)local_78.ancestor_count != &local_78.descendant_count) {
                  operator_delete((void *)local_78.ancestor_count,
                                  CONCAT71(local_78.descendant_count._1_7_,
                                           (undefined1)local_78.descendant_count) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_3b8._1_7_,local_3b8[0]) != &local_3a8) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_3b8._1_7_,local_3b8[0]),
                                  CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                           local_3a8._M_local_buf[0]) + 1);
                }
                if ((pointer)local_58._0_8_ != pcVar41) {
                  operator_delete((void *)local_58._0_8_,
                                  CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
                }
                uVar50 = 0;
              }
              util::
              Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>>
              ::
              value_or<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>&>
                        ((T *)local_3b8,
                         (_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                          *)local_e0,&pWVar23->m_ancestors);
              std::_Rb_tree<$270907ca$>::clear(&(pWVar23->m_ancestors)._M_t);
              p_Var31 = (_Base_ptr)
                        CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0]);
              if (p_Var31 != (_Base_ptr)0x0) {
                (pWVar23->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_3b8._8_4_;
                (pWVar23->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     p_Var31;
                (pWVar23->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     (_Base_ptr)CONCAT71(local_3a8._9_7_,local_3a8._M_local_buf[8]);
                (pWVar23->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     (_Base_ptr)local_398._0_8_;
                p_Var31->_M_parent =
                     &(pWVar23->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header;
                (pWVar23->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     stack0xfffffffffffffc70;
                limits = (Limits *)0x0;
                local_3a8._M_local_buf[0] = '\0';
                local_3a8._M_local_buf[1] = '\0';
                local_3a8._M_local_buf[2] = '\0';
                local_3a8._M_local_buf[3] = '\0';
                local_3a8._M_local_buf[4] = '\0';
                local_3a8._M_local_buf[5] = '\0';
                local_3a8._M_local_buf[6] = '\0';
                local_3a8._M_local_buf[7] = '\0';
                local_398._0_8_ = local_3b8 + 8;
                local_3a8._M_local_buf[8] = (char)local_398._0_8_;
                local_3a8._9_7_ = (undefined7)((ulong)local_398._0_8_ >> 8);
                stack0xfffffffffffffc70 = 0;
              }
              std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)local_3b8);
              std::__detail::__variant::
              _Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
              ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                   *)local_e0);
              bVar20 = Finalize(this_01,args,pWVar23);
              pWVar35 = extraout_RDX_18;
              if (!bVar20) {
                peVar6 = (pWVar23->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                local_170 = *(undefined1 (*) [8])
                             &(pWVar23->m_state).super_ValidationState<TxValidationResult>;
                local_168 = local_160._M_local_buf + 8;
                pcVar9 = (pWVar23->m_state).super_ValidationState<TxValidationResult>.
                         m_reject_reason._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_168,pcVar9,
                           pcVar9 + (pWVar23->m_state).super_ValidationState<TxValidationResult>.
                                    m_reject_reason._M_string_length);
                local_148[0] = local_138;
                pcVar9 = (pWVar23->m_state).super_ValidationState<TxValidationResult>.
                         m_debug_message._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_148,pcVar9,
                           pcVar9 + (pWVar23->m_state).super_ValidationState<TxValidationResult>.
                                    m_debug_message._M_string_length);
                state_13.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
                     = in_stack_fffffffffffff5b0;
                state_13.super_ValidationState<TxValidationResult>._0_8_ = __return_storage_ptr___00
                ;
                state_13.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length
                     = (size_type)in_stack_fffffffffffff5b8;
                state_13.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
                state_13.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
                state_13.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
                     in_stack_fffffffffffff5c8;
                state_13.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p
                     = (pointer)this_01;
                state_13.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length
                     = (size_type)pWVar28;
                state_13.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity._0_4_ = uVar50;
                state_13.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity._4_4_ = uVar51;
                state_13.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                     args;
                MempoolAcceptResult::Failure((MempoolAcceptResult *)local_3b8,state_13);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&local_478,&peVar6->m_witness_hash,(MempoolAcceptResult *)local_3b8);
                if (local_308 == true) {
                  local_308 = false;
                  pvVar17 = (void *)CONCAT71(local_320._1_7_,local_320._0_1_);
                  if (pvVar17 != (void *)0x0) {
                    operator_delete(pvVar17,(long)local_320._M_value.
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)pvVar17);
                  }
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_368);
                if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
                  operator_delete((void *)local_388._0_8_,(ulong)(local_388._16_8_ + 1));
                }
                if ((undefined1 *)
                    CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0]) !=
                    local_398) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                           local_3a8._M_local_buf[0]),
                                  (ulong)((long)&((_Base_ptr)local_398._0_8_)->_M_color + 1));
                }
                if (local_148[0] != local_138) {
                  operator_delete(local_148[0],local_138[0] + 1);
                }
                if (local_168 != local_160._M_local_buf + 8) {
                  operator_delete(local_168,local_160._8_8_ + 1);
                }
                base_blob<256u>::ToString_abi_cxx11_
                          ((string *)local_e0,
                           &((pWVar23->m_ptx->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->hash);
                tinyformat::format<std::__cxx11::string>
                          ((string *)local_3b8,(tinyformat *)"BUG! Adding to mempool failed: %s",
                           (char *)local_e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           limits);
                local_58._8_8_ = (pointer)0x0;
                local_58[0x10] = '\0';
                limits = (Limits *)local_58;
                local_58._0_8_ = pcVar41;
                ValidationState<PackageValidationResult>::Invalid
                          (&local_400,PCKG_MEMPOOL_ERROR,(string *)local_3b8,(string *)limits);
                pWVar35 = extraout_RDX_19;
                if ((pointer)local_58._0_8_ != pcVar41) {
                  operator_delete((void *)local_58._0_8_,
                                  CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
                  pWVar35 = extraout_RDX_20;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_3b8._1_7_,local_3b8[0]) != &local_3a8) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_3b8._1_7_,local_3b8[0]),
                                  CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                           local_3a8._M_local_buf[0]) + 1);
                  pWVar35 = extraout_RDX_21;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0) {
                  operator_delete((void *)local_e0._0_8_,(ulong)(local_d0._0_8_ + 1));
                  pWVar35 = extraout_RDX_22;
                }
                uVar50 = 0;
              }
              pWVar23 = pWVar23 + 1;
            } while (pWVar23 != pWVar28);
          }
          pWVar38 = local_9b8.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pWVar23 = local_9b8.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_978.
          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_978.
          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (transaction_identifier<true> *)0x0;
          local_978.
          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (transaction_identifier<true> *)0x0;
          sVar37 = ((long)local_9b8.
                          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_9b8.
                          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 6) * -0x71c71c71c71c71c7;
          std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::reserve(&local_978,sVar37);
          if (pWVar23 != pWVar38) {
            do {
              peVar6 = (pWVar23->m_ptx->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              uVar13 = *(undefined8 *)
                        (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
              uVar14 = *(undefined8 *)
                        ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 0x10);
              uVar16 = *(undefined8 *)
                        ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 0x18);
              local_3a8._M_local_buf[0] = (char)uVar15;
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)((ulong)uVar15 >> 8);
              local_3a8._M_local_buf[8] = (char)uVar16;
              local_3a8._9_7_ = (undefined7)((ulong)uVar16 >> 8);
              local_3b8[0] = (undefined1)uVar13;
              local_3b8._1_7_ = (undefined7)((ulong)uVar13 >> 8);
              local_3b8._8_4_ = (undefined4)uVar14;
              local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x20);
              if (local_978.
                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_978.
                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>::
                _M_realloc_insert<transaction_identifier<true>>
                          ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                            *)&local_978,
                           (iterator)
                           local_978.
                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (transaction_identifier<true> *)local_3b8);
              }
              else {
                uVar13 = *(undefined8 *)
                          (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                uVar14 = *(undefined8 *)
                          ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                 _M_elems + 8);
                uVar15 = *(undefined8 *)
                          ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                 _M_elems + 0x18);
                *(undefined8 *)
                 (((local_978.
                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.
                  m_data._M_elems + 0x10) =
                     *(undefined8 *)
                      ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                             _M_elems + 0x10);
                *(undefined8 *)
                 (((local_978.
                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.
                  m_data._M_elems + 0x18) = uVar15;
                *(undefined8 *)
                 ((local_978.
                   super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.
                 m_data._M_elems = uVar13;
                *(undefined8 *)
                 (((local_978.
                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.
                  m_data._M_elems + 8) = uVar14;
                local_978.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_978.
                     super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              pWVar23 = pWVar23 + 1;
            } while (pWVar23 != pWVar38);
          }
          replaced_txns = &(this_01->m_subpackage).m_replaced_transactions;
          pMVar49 = this_01;
          pWVar43 = local_9b8.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pWVar25 = local_9b8.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((this_01->m_subpackage).m_replaced_transactions.
              super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)replaced_txns) {
            pLVar29 = LogInstance();
            bVar20 = BCLog::Logger::WillLogCategoryLevel(pLVar29,MEMPOOL,Debug);
            pMVar49 = this_01;
            pWVar43 = local_9b8.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pWVar25 = local_9b8.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (bVar20) {
              local_980 = (this_01->m_subpackage).m_replaced_transactions.
                          super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          ._M_impl._M_node._M_size;
              local_990 = (this_01->m_subpackage).m_total_modified_fees -
                          (this_01->m_subpackage).m_conflicting_fees;
              local_998 = (this_01->m_subpackage).m_total_vsize -
                          (long)(int)(this_01->m_subpackage).m_conflicting_size;
              local_988 = sVar37;
              pLVar29 = LogInstance();
              bVar20 = BCLog::Logger::Enabled(pLVar29);
              pWVar43 = local_9b8.
                        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pWVar25 = local_9b8.
                        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if (bVar20) {
                local_3b8[0] = SUB81(&local_3a8,0);
                local_3b8._1_7_ = (undefined7)((ulong)&local_3a8 >> 8);
                local_3b8._8_4_ = _S_red;
                local_3b8._12_4_ = TX_RESULT_UNSET;
                local_3a8._M_local_buf[0] = '\0';
                tinyformat::format<unsigned_long,unsigned_long,long,long>
                          ((string *)local_e0,
                           (tinyformat *)
                           "replaced %u mempool transactions with %u new one(s) for %s additional fees, %d delta bytes\n"
                           ,(char *)&local_980,&local_988,&local_990,&local_998,
                           (long *)__return_storage_ptr___00);
                _GLOBAL__N_1::MemPoolAccept::AcceptMultipleTransactions();
                pLVar29 = LogInstance();
                str._M_str._1_7_ = local_3b8._1_7_;
                str._M_str._0_1_ = local_3b8[0];
                str._M_len._4_4_ = local_3b8._12_4_;
                str._M_len._0_4_ = local_3b8._8_4_;
                local_58._0_8_ = (pointer)0x57;
                local_58._8_8_ =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                ;
                uVar47 = 0x57;
                uVar48 = 0;
                in_stack_fffffffffffff5b0 =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                ;
                in_stack_fffffffffffff5c0 = 1;
                in_stack_fffffffffffff5b8 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
                source_file._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                ;
                source_file._M_len = 0x57;
                logging_function_00._M_str = "SubmitPackage";
                logging_function_00._M_len = 0xd;
                BCLog::Logger::LogPrintStr
                          (pLVar29,str,logging_function_00,source_file,0x584,MEMPOOL,Debug);
                __return_storage_ptr___00 = (string *)CONCAT44(uVar48,uVar47);
                pWVar43 = local_9b8.
                          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pWVar25 = local_9b8.
                          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_3b8._1_7_,local_3b8[0]) != &local_3a8) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_3b8._1_7_,local_3b8[0]),
                                  CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                           local_3a8._M_local_buf[0]) + 1);
                  __return_storage_ptr___00 = (string *)CONCAT44(uVar48,uVar47);
                  pWVar43 = local_9b8.
                            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pWVar25 = local_9b8.
                            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
              }
            }
          }
          for (; pWVar23 = local_9b8.
                           super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
              pWVar43 !=
              local_9b8.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish; pWVar43 = pWVar43 + 1) {
            if (args->m_package_feerates == true) {
              local_78.ancestor_count = (pWVar43->m_package_feerate).nSatoshisPerK;
              local_9b8.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish = pWVar25;
            }
            else {
              local_9b8.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish = pWVar25;
              CFeeRate::CFeeRate((CFeeRate *)&local_78,&pWVar43->m_modified_fees,
                                 (uint32_t)pWVar43->m_vsize);
            }
            if (args->m_package_feerates == true) {
              std::
              vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
              vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      *)local_58,&local_978);
            }
            else {
              peVar6 = (pWVar43->m_ptx->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              uVar13 = *(undefined8 *)
                        (peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
              uVar14 = *(undefined8 *)
                        ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 0x10);
              uVar16 = *(undefined8 *)
                        ((long)(peVar6->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 0x18);
              local_3a8._M_local_buf[0] = (char)uVar15;
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)((ulong)uVar15 >> 8);
              local_3a8._M_local_buf[8] = (char)uVar16;
              local_3a8._9_7_ = (undefined7)((ulong)uVar16 >> 8);
              local_3b8[0] = (undefined1)uVar13;
              local_3b8._1_7_ = (undefined7)((ulong)uVar13 >> 8);
              local_3b8._8_4_ = (undefined4)uVar14;
              local_3b8._12_4_ = (undefined4)((ulong)uVar14 >> 0x20);
              __l_01._M_len = 1;
              __l_01._M_array = (iterator)local_3b8;
              std::
              vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
              vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      *)local_58,__l_01,(allocator_type *)local_98);
            }
            peVar6 = (pWVar43->m_ptx->
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            MempoolAcceptResult::MempoolAcceptResult
                      ((MempoolAcceptResult *)local_3b8,replaced_txns,pWVar43->m_vsize,
                       pWVar43->m_base_fees,(CFeeRate)local_78.ancestor_count,
                       (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                        *)local_58);
            std::
            _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
            ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                      ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                        *)&local_478,&peVar6->m_witness_hash,(MempoolAcceptResult *)local_3b8);
            if (local_308 == true) {
              local_308 = false;
              pvVar17 = (void *)CONCAT71(local_320._1_7_,local_320._0_1_);
              if (pvVar17 != (void *)0x0) {
                operator_delete(pvVar17,(long)local_320._M_value.
                                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)pvVar17);
              }
            }
            std::__cxx11::
            _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)local_368);
            if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
              operator_delete((void *)local_388._0_8_,(ulong)(local_388._16_8_ + 1));
            }
            if ((undefined1 *)
                CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0]) !=
                local_398) {
              operator_delete((undefined1 *)
                              CONCAT71(local_3a8._M_allocated_capacity._1_7_,
                                       local_3a8._M_local_buf[0]),
                              (ulong)((long)&((_Base_ptr)local_398._0_8_)->_M_color + 1));
            }
            if ((this_01->m_pool->m_opts).signals != (ValidationSignals *)0x0) {
              pCVar10 = pWVar43->m_ptx;
              tx = (pCVar10->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
              pWVar28 = (pointer)pWVar43->m_vsize;
              uVar4 = ((pWVar43->m_entry)._M_t.
                       super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>
                       .super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl)->entryHeight;
              bVar20 = args->m_bypass_limits;
              bVar3 = args->m_package_submission;
              bVar21 = IsCurrentForFeeEstimation(this_01->m_active_chainstate);
              ppCVar18 = &this_01->m_pool;
              this_01 = pMVar49;
              bVar22 = CTxMemPool::HasNoInputsOf(*ppCVar18,tx);
              uVar13 = stack0xfffffffffffffc70;
              peVar6 = (pCVar10->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
              local_3b8[0] = SUB81(peVar6,0);
              local_3b8._1_7_ = (undefined7)((ulong)peVar6 >> 8);
              p_Var11 = (pCVar10->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi;
              local_3b8._8_4_ = SUB84(p_Var11,0);
              local_3b8._12_4_ = (undefined4)((ulong)p_Var11 >> 0x20);
              if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
                }
              }
              local_3a8._M_local_buf[0] = (char)pWVar43->m_base_fees;
              local_3a8._M_allocated_capacity._1_7_ = (undefined7)((ulong)pWVar43->m_base_fees >> 8)
              ;
              local_3a8._M_local_buf[8] = (char)pWVar28;
              local_3a8._9_7_ = (undefined7)((ulong)pWVar28 >> 8);
              bStack_38f = bVar3;
              local_398[8] = bVar20;
              bStack_38e = bVar21;
              uStack_38c = SUB84(uVar13,4);
              bStack_38d = bVar22;
              pCVar12 = this_01->m_pool;
              mempool_sequence = pCVar12->m_sequence_number;
              this_00 = (pCVar12->m_opts).signals;
              pCVar12->m_sequence_number = mempool_sequence + 1;
              pMVar49 = this_01;
              local_398._0_4_ = uVar4;
              ValidationSignals::TransactionAddedToMempool
                        (this_00,(NewMempoolTransactionInfo *)local_3b8,mempool_sequence);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT44(local_3b8._12_4_,local_3b8._8_4_) !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           CONCAT44(local_3b8._12_4_,local_3b8._8_4_));
              }
            }
            if ((pointer)local_58._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_58._0_8_,
                              CONCAT71(local_58._17_7_,local_58[0x10]) - local_58._0_8_);
            }
            pWVar25 = local_9b8.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            local_9b8.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_finish = pWVar23;
          }
          local_9b8.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_finish = pWVar25;
          if (local_978.
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_978.
                            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_978.
                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_978.
                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((uVar50 & 1) == 0) {
            local_900._0_4_ = local_400.m_mode;
            local_900._4_4_ = local_400.m_result;
            plVar46 = local_8e8;
            local_8f8 = plVar46;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_8f8,local_400.m_reject_reason._M_dataplus._M_p,
                       local_400.m_reject_reason._M_dataplus._M_p +
                       local_400.m_reject_reason._M_string_length);
            local_8d8[0] = local_8c8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_8d8,local_400.m_debug_message._M_dataplus._M_p,
                       local_400.m_debug_message._M_dataplus._M_p +
                       local_400.m_debug_message._M_string_length);
            state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p
                 = in_stack_fffffffffffff5b0;
            state_15.super_ValidationState<PackageValidationResult>._0_8_ =
                 __return_storage_ptr___00;
            state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
                 = (size_type)in_stack_fffffffffffff5b8;
            state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
            state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
            state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
                 in_stack_fffffffffffff5c8;
            state_15.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
                 = (pointer)pMVar49;
            state_15.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length
                 = (size_type)pWVar28;
            state_15.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity._0_4_ = uVar50;
            state_15.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity._4_4_ = uVar51;
            state_15.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
                 args;
            PackageMempoolAcceptResult::PackageMempoolAcceptResult
                      (__return_storage_ptr__,state_15,
                       (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)local_900);
            plVar42 = local_8f8;
            if (local_8d8[0] != local_8c8) {
              operator_delete(local_8d8[0],local_8c8[0] + 1);
              plVar42 = local_8f8;
            }
          }
          else {
            local_948._0_4_ = local_400.m_mode;
            local_948._4_4_ = local_400.m_result;
            plVar46 = local_930;
            local_940 = plVar46;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_940,local_400.m_reject_reason._M_dataplus._M_p,
                       local_400.m_reject_reason._M_dataplus._M_p +
                       local_400.m_reject_reason._M_string_length);
            local_920[0] = local_910;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_920,local_400.m_debug_message._M_dataplus._M_p,
                       local_400.m_debug_message._M_dataplus._M_p +
                       local_400.m_debug_message._M_string_length);
            state_14.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p
                 = in_stack_fffffffffffff5b0;
            state_14.super_ValidationState<PackageValidationResult>._0_8_ =
                 __return_storage_ptr___00;
            state_14.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
                 = (size_type)in_stack_fffffffffffff5b8;
            state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
            state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
            state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
                 in_stack_fffffffffffff5c8;
            state_14.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
                 = (pointer)pMVar49;
            state_14.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length
                 = (size_type)pWVar28;
            state_14.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity._0_4_ = uVar50;
            state_14.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity._4_4_ = uVar51;
            state_14.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
                 args;
            PackageMempoolAcceptResult::PackageMempoolAcceptResult
                      (__return_storage_ptr__,state_14,
                       (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)local_948);
            plVar42 = local_940;
            if (local_920[0] != local_910) {
              operator_delete(local_920[0],local_910[0] + 1);
              plVar42 = local_940;
            }
          }
        }
      }
LAB_00b2d390:
      if (plVar42 != plVar46) {
        operator_delete(plVar42,*plVar46 + 1);
      }
LAB_00b2d3a0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628.m_debug_message._M_dataplus._M_p != &local_628.m_debug_message.field_2) {
        operator_delete(local_628.m_debug_message._M_dataplus._M_p,
                        CONCAT71(local_628.m_debug_message.field_2._M_allocated_capacity._1_7_,
                                 local_628.m_debug_message.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628.m_reject_reason._M_dataplus._M_p != &local_628.m_reject_reason.field_2) {
        operator_delete(local_628.m_reject_reason._M_dataplus._M_p,
                        CONCAT71(local_628.m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                 local_628.m_reject_reason.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_9d8.
             super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        pcVar41 = (pointer)((long)local_9d8.
                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                           (long)local_9d8.
                                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        _Var27._M_p = (pointer)local_9d8.
                               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_00b2d417;
      }
    }
    else {
      mempool_ancestors =
           &(local_9b8.
             super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
             ._M_impl.super__Vector_impl_data._M_start)->m_ancestors;
      while( true ) {
        PackageTRUCChecks_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_750,*(CTransactionRef **)(mempool_ancestors + 2),
                   *(int64_t *)
                    ((unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_> *)
                     (mempool_ancestors + 1) + 2),txns,mempool_ancestors);
        if ((bool)local_738[8] == true) break;
        pWVar28 = (pointer)(mempool_ancestors + 10);
        mempool_ancestors = mempool_ancestors + 0xc;
        if (pWVar28 == pWVar23) goto LAB_00b2a932;
      }
      local_3b8[0] = SUB81(&local_3a8,0);
      local_3b8._1_7_ = (undefined7)((ulong)&local_3a8 >> 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"TRUC-violation","");
      if ((bool)local_738[8] == false) goto LAB_00b2dca6;
      ValidationState<PackageValidationResult>::Invalid
                (&local_400,PCKG_POLICY,(string *)local_3b8,(string *)local_750);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_3b8._1_7_,local_3b8[0]) != &local_3a8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_3b8._1_7_,local_3b8[0]),
                        CONCAT71(local_3a8._M_allocated_capacity._1_7_,local_3a8._M_local_buf[0]) +
                        1);
      }
      local_5e0._0_4_ = local_400.m_mode;
      local_5e0._4_4_ = local_400.m_result;
      local_5d8 = local_5c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5d8,local_400.m_reject_reason._M_dataplus._M_p,
                 local_400.m_reject_reason._M_dataplus._M_p +
                 local_400.m_reject_reason._M_string_length);
      local_5b8[0] = local_5a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_5b8,local_400.m_debug_message._M_dataplus._M_p,
                 local_400.m_debug_message._M_dataplus._M_p +
                 local_400.m_debug_message._M_string_length);
      local_398._0_8_ = local_3b8 + 8;
      local_3a8._M_local_buf[0] = '\0';
      local_3a8._M_local_buf[1] = '\0';
      local_3a8._M_local_buf[2] = '\0';
      local_3a8._M_local_buf[3] = '\0';
      local_3a8._M_local_buf[4] = '\0';
      local_3a8._M_local_buf[5] = '\0';
      local_3a8._M_local_buf[6] = '\0';
      local_3a8._M_local_buf[7] = '\0';
      local_3b8[0] = (string)0x0;
      local_3b8[1] = '\0';
      local_3b8[2] = '\0';
      local_3b8[3] = '\0';
      local_3b8[4] = '\0';
      local_3b8[5] = '\0';
      local_3b8[6] = '\0';
      local_3b8[7] = '\0';
      local_3b8._8_4_ = _S_red;
      local_3b8._12_4_ = TX_RESULT_UNSET;
      local_3a8._M_local_buf[8] = (char)local_398._0_8_;
      local_3a8._9_7_ = (undefined7)((ulong)local_398._0_8_ >> 8);
      stack0xfffffffffffffc70 = 0;
      state_02.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffff5ac;
      state_02.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff5a8;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
           in_stack_fffffffffffff5b0;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
           (size_type)in_stack_fffffffffffff5b8;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
           in_stack_fffffffffffff5c8;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
           (pointer)this_01;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
           (size_type)in_stack_fffffffffffff5d8;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity._0_4_ = (int)pWVar43;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity._4_4_ = (int)((ulong)pWVar43 >> 0x20);
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ = args;
      PackageMempoolAcceptResult::PackageMempoolAcceptResult
                (__return_storage_ptr__,state_02,
                 (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  *)local_5e0);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   *)local_3b8);
      if (local_5b8[0] != local_5a8) {
        operator_delete(local_5b8[0],local_5a8[0] + 1);
      }
      if (local_5d8 != local_5c8) {
        operator_delete(local_5d8,(ulong)((long)&local_5c8[0]->_M_color + 1));
      }
      if (((bool)local_738[8] != true) ||
         (local_738._8_8_ = local_738._8_8_ & 0xffffffffffffff00,
         local_4f0._M_allocated_capacity = local_748._8_8_, _Var27._M_p = (pointer)local_750,
         local_750 == (undefined1  [8])(local_748 + 8))) goto LAB_00b2d41c;
LAB_00b2b56d:
      pcVar41 = (pointer)(local_4f0._M_allocated_capacity + 1);
LAB_00b2d417:
      operator_delete(_Var27._M_p,(ulong)pcVar41);
    }
LAB_00b2d41c:
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_958);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~_Rb_tree(&local_478);
    std::
    vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ::~vector(&local_9b8);
  }
  else {
    local_448._0_4_ = local_400.m_mode;
    local_448._4_4_ = local_400.m_result;
    local_440 = local_430;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_440,local_400.m_reject_reason._M_dataplus._M_p,
               local_400.m_reject_reason._M_dataplus._M_p +
               local_400.m_reject_reason._M_string_length);
    local_420[0] = local_410;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_420,local_400.m_debug_message._M_dataplus._M_p,
               local_400.m_debug_message._M_dataplus._M_p +
               local_400.m_debug_message._M_string_length);
    local_398._0_8_ = local_3b8 + 8;
    local_3a8._M_local_buf[0] = '\0';
    local_3a8._M_local_buf[1] = '\0';
    local_3a8._M_local_buf[2] = '\0';
    local_3a8._M_local_buf[3] = '\0';
    local_3a8._M_local_buf[4] = '\0';
    local_3a8._M_local_buf[5] = '\0';
    local_3a8._M_local_buf[6] = '\0';
    local_3a8._M_local_buf[7] = '\0';
    local_3b8[0] = (string)0x0;
    local_3b8[1] = '\0';
    local_3b8[2] = '\0';
    local_3b8[3] = '\0';
    local_3b8[4] = '\0';
    local_3b8[5] = '\0';
    local_3b8[6] = '\0';
    local_3b8[7] = '\0';
    local_3b8._8_4_ = _S_red;
    local_3b8._12_4_ = TX_RESULT_UNSET;
    local_3a8._M_local_buf[8] = (char)local_398._0_8_;
    local_3a8._9_7_ = (undefined7)((ulong)local_398._0_8_ >> 8);
    stack0xfffffffffffffc70 = 0;
    state.super_ValidationState<PackageValidationResult>.m_result = in_stack_fffffffffffff5ac;
    state.super_ValidationState<PackageValidationResult>.m_mode = in_stack_fffffffffffff5a8;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
         in_stack_fffffffffffff5b0;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length =
         (size_type)in_stack_fffffffffffff5b8;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5c0;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5c4;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
         in_stack_fffffffffffff5c8;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)in_stack_fffffffffffff5d0;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
         (size_type)in_stack_fffffffffffff5d8;
    state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
    _M_allocated_capacity._0_4_ = in_stack_fffffffffffff5e0;
    state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
    _M_allocated_capacity._4_4_ = in_stack_fffffffffffff5e4;
    state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
         in_stack_fffffffffffff5e8;
    PackageMempoolAcceptResult::PackageMempoolAcceptResult
              (__return_storage_ptr__,state,
               (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)local_448);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 *)local_3b8);
    if (local_420[0] != local_410) {
      operator_delete(local_420[0],local_410[0] + 1);
    }
    if (local_440 != local_430) {
      operator_delete(local_440,(ulong)((long)&local_430[0]->_M_color + 1));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400.m_debug_message._M_dataplus._M_p != &local_400.m_debug_message.field_2) {
    operator_delete(local_400.m_debug_message._M_dataplus._M_p,
                    CONCAT71(local_400.m_debug_message.field_2._M_allocated_capacity._1_7_,
                             local_400.m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400.m_reject_reason._M_dataplus._M_p != &local_400.m_reject_reason.field_2) {
    operator_delete(local_400.m_reject_reason._M_dataplus._M_p,
                    CONCAT71(local_400.m_reject_reason.field_2._M_allocated_capacity._1_7_,
                             local_400.m_reject_reason.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00b2ed6b:
  __stack_chk_fail();
LAB_00b2dc67:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    std::__throw_bad_optional_access();
  }
  goto LAB_00b2ed6b;
}

Assistant:

PackageMempoolAcceptResult MemPoolAccept::AcceptMultipleTransactions(const std::vector<CTransactionRef>& txns, ATMPArgs& args)
{
    AssertLockHeld(cs_main);

    // These context-free package limits can be done before taking the mempool lock.
    PackageValidationState package_state;
    if (!IsWellFormedPackage(txns, package_state, /*require_sorted=*/true)) return PackageMempoolAcceptResult(package_state, {});

    std::vector<Workspace> workspaces{};
    workspaces.reserve(txns.size());
    std::transform(txns.cbegin(), txns.cend(), std::back_inserter(workspaces),
                   [](const auto& tx) { return Workspace(tx); });
    std::map<uint256, MempoolAcceptResult> results;

    LOCK(m_pool.cs);

    // Do all PreChecks first and fail fast to avoid running expensive script checks when unnecessary.
    for (Workspace& ws : workspaces) {
        if (!PreChecks(args, ws)) {
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }

        // Individual modified feerate exceeded caller-defined max; abort
        // N.B. this doesn't take into account CPFPs. Chunk-aware validation may be more robust.
        if (args.m_client_maxfeerate && CFeeRate(ws.m_modified_fees, ws.m_vsize) > args.m_client_maxfeerate.value()) {
            // Need to set failure here both individually and at package level
            ws.m_state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "max feerate exceeded", "");
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }

        // Make the coins created by this transaction available for subsequent transactions in the
        // package to spend. If there are no conflicts within the package, no transaction can spend a coin
        // needed by another transaction in the package. We also need to make sure that no package
        // tx replaces (or replaces the ancestor of) the parent of another package tx. As long as we
        // check these two things, we don't need to track the coins spent.
        // If a package tx conflicts with a mempool tx, PackageMempoolChecks() ensures later that any package RBF attempt
        // has *no* in-mempool ancestors, so we don't have to worry about subsequent transactions in
        // same package spending the same in-mempool outpoints. This needs to be revisited for general
        // package RBF.
        m_viewmempool.PackageAddTransaction(ws.m_ptx);
    }

    // At this point we have all in-mempool ancestors, and we know every transaction's vsize.
    // Run the TRUC checks on the package.
    for (Workspace& ws : workspaces) {
        if (auto err{PackageTRUCChecks(ws.m_ptx, ws.m_vsize, txns, ws.m_ancestors)}) {
            package_state.Invalid(PackageValidationResult::PCKG_POLICY, "TRUC-violation", err.value());
            return PackageMempoolAcceptResult(package_state, {});
        }
    }

    // Transactions must meet two minimum feerates: the mempool minimum fee and min relay fee.
    // For transactions consisting of exactly one child and its parents, it suffices to use the
    // package feerate (total modified fees / total virtual size) to check this requirement.
    // Note that this is an aggregate feerate; this function has not checked that there are transactions
    // too low feerate to pay for themselves, or that the child transactions are higher feerate than
    // their parents. Using aggregate feerate may allow "parents pay for child" behavior and permit
    // a child that is below mempool minimum feerate. To avoid these behaviors, callers of
    // AcceptMultipleTransactions need to restrict txns topology (e.g. to ancestor sets) and check
    // the feerates of individuals and subsets.
    m_subpackage.m_total_vsize = std::accumulate(workspaces.cbegin(), workspaces.cend(), int64_t{0},
        [](int64_t sum, auto& ws) { return sum + ws.m_vsize; });
    m_subpackage.m_total_modified_fees = std::accumulate(workspaces.cbegin(), workspaces.cend(), CAmount{0},
        [](CAmount sum, auto& ws) { return sum + ws.m_modified_fees; });
    const CFeeRate package_feerate(m_subpackage.m_total_modified_fees, m_subpackage.m_total_vsize);
    std::vector<Wtxid> all_package_wtxids;
    all_package_wtxids.reserve(workspaces.size());
    std::transform(workspaces.cbegin(), workspaces.cend(), std::back_inserter(all_package_wtxids),
                   [](const auto& ws) { return ws.m_ptx->GetWitnessHash(); });
    TxValidationState placeholder_state;
    if (args.m_package_feerates &&
        !CheckFeeRate(m_subpackage.m_total_vsize, m_subpackage.m_total_modified_fees, placeholder_state)) {
        package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
        return PackageMempoolAcceptResult(package_state, {{workspaces.back().m_ptx->GetWitnessHash(),
            MempoolAcceptResult::FeeFailure(placeholder_state, CFeeRate(m_subpackage.m_total_modified_fees, m_subpackage.m_total_vsize), all_package_wtxids)}});
    }

    // Apply package mempool ancestor/descendant limits. Skip if there is only one transaction,
    // because it's unnecessary.
    if (txns.size() > 1 && !PackageMempoolChecks(txns, workspaces, m_subpackage.m_total_vsize, package_state)) {
        return PackageMempoolAcceptResult(package_state, std::move(results));
    }

    for (Workspace& ws : workspaces) {
        ws.m_package_feerate = package_feerate;
        if (!PolicyScriptChecks(args, ws)) {
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }
        if (args.m_test_accept) {
            const auto effective_feerate = args.m_package_feerates ? ws.m_package_feerate :
                CFeeRate{ws.m_modified_fees, static_cast<uint32_t>(ws.m_vsize)};
            const auto effective_feerate_wtxids = args.m_package_feerates ? all_package_wtxids :
                std::vector<Wtxid>{ws.m_ptx->GetWitnessHash()};
            results.emplace(ws.m_ptx->GetWitnessHash(),
                            MempoolAcceptResult::Success(std::move(m_subpackage.m_replaced_transactions),
                                                         ws.m_vsize, ws.m_base_fees, effective_feerate,
                                                         effective_feerate_wtxids));
        }
    }

    if (args.m_test_accept) return PackageMempoolAcceptResult(package_state, std::move(results));

    if (!SubmitPackage(args, workspaces, package_state, results)) {
        // PackageValidationState filled in by SubmitPackage().
        return PackageMempoolAcceptResult(package_state, std::move(results));
    }

    return PackageMempoolAcceptResult(package_state, std::move(results));
}